

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  bool bVar51;
  uint uVar52;
  ulong uVar53;
  byte bVar54;
  uint uVar55;
  long lVar56;
  ulong uVar57;
  uint uVar58;
  undefined1 auVar59 [8];
  uint uVar60;
  float fVar61;
  undefined4 uVar62;
  float fVar63;
  float fVar91;
  float fVar93;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar92;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined8 uVar94;
  vint4 bi_1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  float fVar120;
  vint4 ai_2;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  float fVar141;
  float fVar142;
  float fVar158;
  float fVar159;
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar160;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  vfloat4 a0_3;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar190;
  float fVar191;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar192;
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar219;
  vfloat4 a0_1;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar238;
  float fVar249;
  float fVar250;
  vfloat4 a0;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar251;
  undefined1 auVar248 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_51c;
  float local_518;
  undefined1 auStack_514 [12];
  undefined1 local_508 [8];
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  long local_498;
  Primitive *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  uint local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  ulong local_370;
  undefined1 local_368 [32];
  RTCFilterFunctionNArguments local_348;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 auStack_2e8 [16];
  uint auStack_2d8 [4];
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined8 local_2bc;
  undefined4 local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  uint uStack_178;
  float afStack_174 [7];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar271 [32];
  
  PVar3 = prim[1];
  uVar57 = (ulong)(byte)PVar3;
  fVar61 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar64._0_4_ = fVar61 * auVar12._0_4_;
  auVar64._4_4_ = fVar61 * auVar12._4_4_;
  auVar64._8_4_ = fVar61 * auVar12._8_4_;
  auVar64._12_4_ = fVar61 * auVar12._12_4_;
  auVar143._0_4_ = fVar61 * (ray->dir).field_0.m128[0];
  auVar143._4_4_ = fVar61 * (ray->dir).field_0.m128[1];
  auVar143._8_4_ = fVar61 * (ray->dir).field_0.m128[2];
  auVar143._12_4_ = fVar61 * (ray->dir).field_0.m128[3];
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar268 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar268 = vcvtdq2ps_avx(auVar268);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar57 + 6)));
  auVar241 = vcvtdq2ps_avx(auVar241);
  uVar53 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + uVar57 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar53 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar53 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar260._4_4_ = auVar143._0_4_;
  auVar260._0_4_ = auVar143._0_4_;
  auVar260._8_4_ = auVar143._0_4_;
  auVar260._12_4_ = auVar143._0_4_;
  auVar96 = vshufps_avx(auVar143,auVar143,0x55);
  auVar233 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar61 = auVar233._0_4_;
  auVar230._0_4_ = fVar61 * auVar268._0_4_;
  fVar91 = auVar233._4_4_;
  auVar230._4_4_ = fVar91 * auVar268._4_4_;
  fVar120 = auVar233._8_4_;
  auVar230._8_4_ = fVar120 * auVar268._8_4_;
  fVar92 = auVar233._12_4_;
  auVar230._12_4_ = fVar92 * auVar268._12_4_;
  auVar220._0_4_ = auVar241._0_4_ * fVar61;
  auVar220._4_4_ = auVar241._4_4_ * fVar91;
  auVar220._8_4_ = auVar241._8_4_ * fVar120;
  auVar220._12_4_ = auVar241._12_4_ * fVar92;
  auVar193._0_4_ = auVar109._0_4_ * fVar61;
  auVar193._4_4_ = auVar109._4_4_ * fVar91;
  auVar193._8_4_ = auVar109._8_4_ * fVar120;
  auVar193._12_4_ = auVar109._12_4_ * fVar92;
  auVar233 = vfmadd231ps_fma(auVar230,auVar96,auVar9);
  auVar97 = vfmadd231ps_fma(auVar220,auVar96,auVar11);
  auVar96 = vfmadd231ps_fma(auVar193,auVar65,auVar96);
  auVar121 = vfmadd231ps_fma(auVar233,auVar260,auVar12);
  auVar97 = vfmadd231ps_fma(auVar97,auVar260,auVar10);
  auVar124 = vfmadd231ps_fma(auVar96,auVar66,auVar260);
  auVar261._4_4_ = auVar64._0_4_;
  auVar261._0_4_ = auVar64._0_4_;
  auVar261._8_4_ = auVar64._0_4_;
  auVar261._12_4_ = auVar64._0_4_;
  auVar96 = vshufps_avx(auVar64,auVar64,0x55);
  auVar233 = vshufps_avx(auVar64,auVar64,0xaa);
  fVar61 = auVar233._0_4_;
  auVar144._0_4_ = fVar61 * auVar268._0_4_;
  fVar91 = auVar233._4_4_;
  auVar144._4_4_ = fVar91 * auVar268._4_4_;
  fVar120 = auVar233._8_4_;
  auVar144._8_4_ = fVar120 * auVar268._8_4_;
  fVar92 = auVar233._12_4_;
  auVar144._12_4_ = fVar92 * auVar268._12_4_;
  auVar95._0_4_ = auVar241._0_4_ * fVar61;
  auVar95._4_4_ = auVar241._4_4_ * fVar91;
  auVar95._8_4_ = auVar241._8_4_ * fVar120;
  auVar95._12_4_ = auVar241._12_4_ * fVar92;
  auVar233._0_4_ = auVar109._0_4_ * fVar61;
  auVar233._4_4_ = auVar109._4_4_ * fVar91;
  auVar233._8_4_ = auVar109._8_4_ * fVar120;
  auVar233._12_4_ = auVar109._12_4_ * fVar92;
  auVar9 = vfmadd231ps_fma(auVar144,auVar96,auVar9);
  auVar268 = vfmadd231ps_fma(auVar95,auVar96,auVar11);
  auVar11 = vfmadd231ps_fma(auVar233,auVar96,auVar65);
  auVar241 = vfmadd231ps_fma(auVar9,auVar261,auVar12);
  auVar65 = vfmadd231ps_fma(auVar268,auVar261,auVar10);
  auVar109 = vfmadd231ps_fma(auVar11,auVar261,auVar66);
  local_3d8._8_4_ = 0x7fffffff;
  local_3d8._0_8_ = 0x7fffffff7fffffff;
  local_3d8._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar121,local_3d8);
  auVar132._8_4_ = 0x219392ef;
  auVar132._0_8_ = 0x219392ef219392ef;
  auVar132._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar132,1);
  auVar9 = vblendvps_avx(auVar121,auVar132,auVar12);
  auVar12 = vandps_avx(auVar97,local_3d8);
  auVar12 = vcmpps_avx(auVar12,auVar132,1);
  auVar268 = vblendvps_avx(auVar97,auVar132,auVar12);
  auVar12 = vandps_avx(auVar124,local_3d8);
  auVar12 = vcmpps_avx(auVar12,auVar132,1);
  auVar12 = vblendvps_avx(auVar124,auVar132,auVar12);
  auVar10 = vrcpps_avx(auVar9);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar176);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar268);
  auVar268 = vfnmadd213ps_fma(auVar268,auVar9,auVar176);
  auVar11 = vfmadd132ps_fma(auVar268,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar9,auVar176);
  auVar66 = vfmadd132ps_fma(auVar12,auVar9,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar241);
  auVar124._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar124._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar124._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar124._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar9);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar241);
  auVar145._0_4_ = auVar10._0_4_ * auVar12._0_4_;
  auVar145._4_4_ = auVar10._4_4_ * auVar12._4_4_;
  auVar145._8_4_ = auVar10._8_4_ * auVar12._8_4_;
  auVar145._12_4_ = auVar10._12_4_ * auVar12._12_4_;
  auVar97._1_3_ = 0;
  auVar97[0] = PVar3;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar268);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar57 * -2 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar65);
  auVar194._0_4_ = auVar12._0_4_ * auVar11._0_4_;
  auVar194._4_4_ = auVar12._4_4_ * auVar11._4_4_;
  auVar194._8_4_ = auVar12._8_4_ * auVar11._8_4_;
  auVar194._12_4_ = auVar12._12_4_ * auVar11._12_4_;
  auVar12 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar12,auVar65);
  auVar96._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar96._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar96._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar96._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar53 + uVar57 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar109);
  auVar121._0_4_ = auVar66._0_4_ * auVar12._0_4_;
  auVar121._4_4_ = auVar66._4_4_ * auVar12._4_4_;
  auVar121._8_4_ = auVar66._8_4_ * auVar12._8_4_;
  auVar121._12_4_ = auVar66._12_4_ * auVar12._12_4_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar241);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar109);
  auVar65._0_4_ = auVar66._0_4_ * auVar12._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar12._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar12._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar124,auVar145);
  auVar9 = vpminsd_avx(auVar194,auVar96);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vpminsd_avx(auVar121,auVar65);
  uVar62 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar204._4_4_ = uVar62;
  auVar204._0_4_ = uVar62;
  auVar204._8_4_ = uVar62;
  auVar204._12_4_ = uVar62;
  auVar9 = vmaxps_avx(auVar9,auVar204);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  local_258._0_4_ = auVar12._0_4_ * 0.99999964;
  local_258._4_4_ = auVar12._4_4_ * 0.99999964;
  local_258._8_4_ = auVar12._8_4_ * 0.99999964;
  local_258._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar124,auVar145);
  auVar9 = vpmaxsd_avx(auVar194,auVar96);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar9 = vpmaxsd_avx(auVar121,auVar65);
  fVar61 = ray->tfar;
  auVar109._4_4_ = fVar61;
  auVar109._0_4_ = fVar61;
  auVar109._8_4_ = fVar61;
  auVar109._12_4_ = fVar61;
  auVar9 = vminps_avx(auVar9,auVar109);
  auVar12 = vminps_avx(auVar12,auVar9);
  auVar66._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar97[4] = PVar3;
  auVar97._5_3_ = 0;
  auVar97[8] = PVar3;
  auVar97._9_3_ = 0;
  auVar97[0xc] = PVar3;
  auVar97._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar97,_DAT_01f7fcf0);
  auVar12 = vcmpps_avx(local_258,auVar66,2);
  auVar12 = vandps_avx(auVar12,auVar9);
  uVar52 = vmovmskps_avx(auVar12);
  if (uVar52 == 0) {
    return false;
  }
  uVar52 = uVar52 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_3e8 = 0x80000000;
  uStack_3e4 = 0x80000000;
  uStack_3e0 = 0x80000000;
  uStack_3dc = 0x80000000;
LAB_015f861c:
  lVar56 = 0;
  auVar59 = (undefined1  [8])(ulong)uVar52;
  for (uVar53 = (ulong)auVar59; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar52 = *(uint *)(prim + 2);
  local_370 = (ulong)*(uint *)(prim + lVar56 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar52].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           local_370 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar12 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar53);
  lVar56 = uVar53 + 1;
  auVar9 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar56);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar268 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar53);
  auVar10 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar56);
  auVar67._8_4_ = 0x3eaaaaab;
  auVar67._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar67._12_4_ = 0x3eaaaaab;
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar53),auVar12,auVar67);
  auVar109 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar4[2].intersectionFilterN +
                               (long)pGVar4[2].pointQueryFunc * lVar56),auVar9,auVar67);
  auVar241 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              uVar53 * *(long *)&pGVar4[3].fnumTimeSegments),auVar268,auVar67);
  auVar96 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              *(long *)&pGVar4[3].fnumTimeSegments * lVar56),auVar10,auVar67);
  auVar97 = ZEXT816(0) << 0x40;
  auVar68._0_4_ = auVar9._0_4_ * 0.0;
  auVar68._4_4_ = auVar9._4_4_ * 0.0;
  auVar68._8_4_ = auVar9._8_4_ * 0.0;
  auVar68._12_4_ = auVar9._12_4_ * 0.0;
  auVar65 = vfmadd231ps_fma(auVar68,auVar109,auVar97);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar65);
  local_4a8._0_4_ = auVar12._0_4_ + auVar66._0_4_;
  local_4a8._4_4_ = auVar12._4_4_ + auVar66._4_4_;
  fStack_4a0 = auVar12._8_4_ + auVar66._8_4_;
  fStack_49c = auVar12._12_4_ + auVar66._12_4_;
  auVar252._8_4_ = 0x40400000;
  auVar252._0_8_ = 0x4040000040400000;
  auVar252._12_4_ = 0x40400000;
  auVar66 = vfmadd231ps_fma(auVar65,auVar11,auVar252);
  auVar233 = vfnmadd231ps_fma(auVar66,auVar12,auVar252);
  auVar205._0_4_ = auVar10._0_4_ * 0.0;
  auVar205._4_4_ = auVar10._4_4_ * 0.0;
  auVar205._8_4_ = auVar10._8_4_ * 0.0;
  auVar205._12_4_ = auVar10._12_4_ * 0.0;
  auVar65 = vfmadd231ps_fma(auVar205,auVar96,auVar97);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar241,auVar65);
  auVar239._0_4_ = auVar268._0_4_ + auVar66._0_4_;
  auVar239._4_4_ = auVar268._4_4_ + auVar66._4_4_;
  auVar239._8_4_ = auVar268._8_4_ + auVar66._8_4_;
  auVar239._12_4_ = auVar268._12_4_ + auVar66._12_4_;
  auVar66 = vfmadd231ps_fma(auVar65,auVar241,auVar252);
  auVar65 = vfnmadd231ps_fma(auVar66,auVar268,auVar252);
  auVar66 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar109,auVar9);
  auVar66 = vfmadd231ps_fma(auVar66,auVar11,auVar97);
  auVar66 = vfmadd231ps_fma(auVar66,auVar12,auVar97);
  auVar122._0_4_ = auVar9._0_4_ * 3.0;
  auVar122._4_4_ = auVar9._4_4_ * 3.0;
  auVar122._8_4_ = auVar9._8_4_ * 3.0;
  auVar122._12_4_ = auVar9._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar122,auVar252,auVar109);
  auVar9 = vfmadd231ps_fma(auVar9,auVar97,auVar11);
  auVar109 = vfnmadd231ps_fma(auVar9,auVar97,auVar12);
  auVar12 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar96,auVar10);
  auVar12 = vfmadd231ps_fma(auVar12,auVar241,auVar97);
  auVar11 = vfmadd231ps_fma(auVar12,auVar268,auVar97);
  auVar161._0_4_ = auVar10._0_4_ * 3.0;
  auVar161._4_4_ = auVar10._4_4_ * 3.0;
  auVar161._8_4_ = auVar10._8_4_ * 3.0;
  auVar161._12_4_ = auVar10._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar161,auVar252,auVar96);
  auVar12 = vfmadd231ps_fma(auVar12,auVar97,auVar241);
  auVar96 = vfnmadd231ps_fma(auVar12,auVar97,auVar268);
  auVar12 = vshufps_avx(auVar233,auVar233,0xc9);
  auVar9 = vshufps_avx(auVar239,auVar239,0xc9);
  fVar175 = auVar233._0_4_;
  auVar177._0_4_ = fVar175 * auVar9._0_4_;
  fVar190 = auVar233._4_4_;
  auVar177._4_4_ = fVar190 * auVar9._4_4_;
  fVar191 = auVar233._8_4_;
  auVar177._8_4_ = fVar191 * auVar9._8_4_;
  fVar192 = auVar233._12_4_;
  auVar177._12_4_ = fVar192 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar177,auVar12,auVar239);
  auVar268 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar65,auVar65,0xc9);
  auVar195._0_4_ = auVar9._0_4_ * fVar175;
  auVar195._4_4_ = auVar9._4_4_ * fVar190;
  auVar195._8_4_ = auVar9._8_4_ * fVar191;
  auVar195._12_4_ = auVar9._12_4_ * fVar192;
  auVar12 = vfmsub231ps_fma(auVar195,auVar12,auVar65);
  auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar9 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar12 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar61 = auVar109._0_4_;
  auVar206._0_4_ = auVar12._0_4_ * fVar61;
  fVar91 = auVar109._4_4_;
  auVar206._4_4_ = auVar12._4_4_ * fVar91;
  fVar120 = auVar109._8_4_;
  auVar206._8_4_ = auVar12._8_4_ * fVar120;
  fVar92 = auVar109._12_4_;
  auVar206._12_4_ = auVar12._12_4_ * fVar92;
  auVar12 = vfmsub231ps_fma(auVar206,auVar9,auVar11);
  auVar11 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar241 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar12 = vdpps_avx(auVar268,auVar268,0x7f);
  auVar207._0_4_ = auVar241._0_4_ * fVar61;
  auVar207._4_4_ = auVar241._4_4_ * fVar91;
  auVar207._8_4_ = auVar241._8_4_ * fVar120;
  auVar207._12_4_ = auVar241._12_4_ * fVar92;
  auVar9 = vfmsub231ps_fma(auVar207,auVar9,auVar96);
  auVar241 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar63 = auVar12._0_4_;
  auVar208._4_12_ = ZEXT812(0) << 0x20;
  auVar208._0_4_ = fVar63;
  auVar9 = vrsqrtss_avx(auVar208,auVar208);
  fVar93 = auVar9._0_4_;
  fVar142 = fVar93 * 1.5 - fVar63 * 0.5 * fVar93 * fVar93 * fVar93;
  auVar9 = vdpps_avx(auVar268,auVar10,0x7f);
  fVar141 = fVar142 * auVar268._0_4_;
  fVar158 = fVar142 * auVar268._4_4_;
  fVar159 = fVar142 * auVar268._8_4_;
  fVar160 = fVar142 * auVar268._12_4_;
  auVar196._0_4_ = fVar63 * auVar10._0_4_;
  auVar196._4_4_ = fVar63 * auVar10._4_4_;
  auVar196._8_4_ = fVar63 * auVar10._8_4_;
  auVar196._12_4_ = fVar63 * auVar10._12_4_;
  fVar93 = auVar9._0_4_;
  auVar178._0_4_ = fVar93 * auVar268._0_4_;
  auVar178._4_4_ = fVar93 * auVar268._4_4_;
  auVar178._8_4_ = fVar93 * auVar268._8_4_;
  auVar178._12_4_ = fVar93 * auVar268._12_4_;
  auVar268 = vsubps_avx(auVar196,auVar178);
  auVar9 = vrcpss_avx(auVar208,auVar208);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar93 = auVar9._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar63 = auVar12._0_4_;
  auVar209._4_12_ = ZEXT812(0) << 0x20;
  auVar209._0_4_ = fVar63;
  auVar9 = vrsqrtss_avx(auVar209,auVar209);
  fVar219 = auVar9._0_4_;
  fVar219 = fVar219 * 1.5 - fVar63 * 0.5 * fVar219 * fVar219 * fVar219;
  auVar9 = vdpps_avx(auVar11,auVar241,0x7f);
  fVar238 = fVar219 * auVar11._0_4_;
  fVar249 = fVar219 * auVar11._4_4_;
  fVar250 = fVar219 * auVar11._8_4_;
  fVar251 = fVar219 * auVar11._12_4_;
  auVar162._0_4_ = fVar63 * auVar241._0_4_;
  auVar162._4_4_ = fVar63 * auVar241._4_4_;
  auVar162._8_4_ = fVar63 * auVar241._8_4_;
  auVar162._12_4_ = fVar63 * auVar241._12_4_;
  fVar63 = auVar9._0_4_;
  auVar133._0_4_ = fVar63 * auVar11._0_4_;
  auVar133._4_4_ = fVar63 * auVar11._4_4_;
  auVar133._8_4_ = fVar63 * auVar11._8_4_;
  auVar133._12_4_ = fVar63 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar162,auVar133);
  auVar9 = vrcpss_avx(auVar209,auVar209);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar9,ZEXT416(0x40000000));
  fVar63 = auVar12._0_4_ * auVar9._0_4_;
  auVar12 = vshufps_avx(_local_4a8,_local_4a8,0xff);
  auVar197._0_4_ = auVar12._0_4_ * fVar141;
  auVar197._4_4_ = auVar12._4_4_ * fVar158;
  auVar197._8_4_ = auVar12._8_4_ * fVar159;
  auVar197._12_4_ = auVar12._12_4_ * fVar160;
  local_3f8 = vsubps_avx(_local_4a8,auVar197);
  auVar9 = vshufps_avx(auVar233,auVar233,0xff);
  auVar146._0_4_ = auVar9._0_4_ * fVar141 + auVar12._0_4_ * fVar142 * fVar93 * auVar268._0_4_;
  auVar146._4_4_ = auVar9._4_4_ * fVar158 + auVar12._4_4_ * fVar142 * fVar93 * auVar268._4_4_;
  auVar146._8_4_ = auVar9._8_4_ * fVar159 + auVar12._8_4_ * fVar142 * fVar93 * auVar268._8_4_;
  auVar146._12_4_ = auVar9._12_4_ * fVar160 + auVar12._12_4_ * fVar142 * fVar93 * auVar268._12_4_;
  auVar268 = vsubps_avx(auVar233,auVar146);
  local_408._0_4_ = auVar197._0_4_ + (float)local_4a8._0_4_;
  local_408._4_4_ = auVar197._4_4_ + (float)local_4a8._4_4_;
  fStack_400 = auVar197._8_4_ + fStack_4a0;
  fStack_3fc = auVar197._12_4_ + fStack_49c;
  auVar12 = vshufps_avx(auVar66,auVar66,0xff);
  auVar98._0_4_ = fVar238 * auVar12._0_4_;
  auVar98._4_4_ = fVar249 * auVar12._4_4_;
  auVar98._8_4_ = fVar250 * auVar12._8_4_;
  auVar98._12_4_ = fVar251 * auVar12._12_4_;
  local_418 = vsubps_avx(auVar66,auVar98);
  auVar9 = vshufps_avx(auVar109,auVar109,0xff);
  auVar69._0_4_ = fVar238 * auVar9._0_4_ + auVar12._0_4_ * fVar219 * auVar10._0_4_ * fVar63;
  auVar69._4_4_ = fVar249 * auVar9._4_4_ + auVar12._4_4_ * fVar219 * auVar10._4_4_ * fVar63;
  auVar69._8_4_ = fVar250 * auVar9._8_4_ + auVar12._8_4_ * fVar219 * auVar10._8_4_ * fVar63;
  auVar69._12_4_ = fVar251 * auVar9._12_4_ + auVar12._12_4_ * fVar219 * auVar10._12_4_ * fVar63;
  auVar12 = vsubps_avx(auVar109,auVar69);
  local_488 = auVar66._0_4_ + auVar98._0_4_;
  fStack_484 = auVar66._4_4_ + auVar98._4_4_;
  fStack_480 = auVar66._8_4_ + auVar98._8_4_;
  fStack_47c = auVar66._12_4_ + auVar98._12_4_;
  local_428._0_4_ = local_3f8._0_4_ + auVar268._0_4_ * 0.33333334;
  local_428._4_4_ = local_3f8._4_4_ + auVar268._4_4_ * 0.33333334;
  local_428._8_4_ = local_3f8._8_4_ + auVar268._8_4_ * 0.33333334;
  local_428._12_4_ = local_3f8._12_4_ + auVar268._12_4_ * 0.33333334;
  auVar70._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar70._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar70._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar70._12_4_ = auVar12._12_4_ * 0.33333334;
  local_438 = vsubps_avx(local_418,auVar70);
  aVar1 = (ray->org).field_0;
  auVar268 = vsubps_avx(local_3f8,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar268,auVar268,0x55);
  auVar9 = vshufps_avx(auVar268,auVar268,0xaa);
  aVar2 = (pre->ray_space).vy.field_0;
  fVar93 = (pre->ray_space).vz.field_0.m128[0];
  fVar63 = (pre->ray_space).vz.field_0.m128[1];
  fVar142 = (pre->ray_space).vz.field_0.m128[2];
  fVar219 = (pre->ray_space).vz.field_0.m128[3];
  auVar71._0_4_ = fVar93 * auVar9._0_4_;
  auVar71._4_4_ = fVar63 * auVar9._4_4_;
  auVar71._8_4_ = fVar142 * auVar9._8_4_;
  auVar71._12_4_ = fVar219 * auVar9._12_4_;
  auVar96 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar12);
  auVar10 = vsubps_avx(local_428,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar72._0_4_ = fVar93 * auVar9._0_4_;
  auVar72._4_4_ = fVar63 * auVar9._4_4_;
  auVar72._8_4_ = fVar142 * auVar9._8_4_;
  auVar72._12_4_ = fVar219 * auVar9._12_4_;
  auVar233 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar2,auVar12);
  auVar9 = vsubps_avx(local_438,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar73._0_4_ = fVar93 * auVar12._0_4_;
  auVar73._4_4_ = fVar63 * auVar12._4_4_;
  auVar73._8_4_ = fVar142 * auVar12._8_4_;
  auVar73._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar9,auVar9,0x55);
  auVar97 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar12);
  auVar11 = vsubps_avx(local_418,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar74._0_4_ = fVar93 * auVar12._0_4_;
  auVar74._4_4_ = fVar63 * auVar12._4_4_;
  auVar74._8_4_ = fVar142 * auVar12._8_4_;
  auVar74._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar121 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar12);
  auVar241 = vsubps_avx(_local_408,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar147._0_4_ = fVar93 * auVar12._0_4_;
  auVar147._4_4_ = fVar63 * auVar12._4_4_;
  auVar147._8_4_ = fVar142 * auVar12._8_4_;
  auVar147._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar241,auVar241,0x55);
  auVar124 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar12);
  local_448._0_4_ = (fVar175 + auVar146._0_4_) * 0.33333334 + (float)local_408._0_4_;
  local_448._4_4_ = (fVar190 + auVar146._4_4_) * 0.33333334 + (float)local_408._4_4_;
  fStack_440 = (fVar191 + auVar146._8_4_) * 0.33333334 + fStack_400;
  fStack_43c = (fVar192 + auVar146._12_4_) * 0.33333334 + fStack_3fc;
  auVar66 = vsubps_avx(_local_448,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar221._0_4_ = fVar93 * auVar12._0_4_;
  auVar221._4_4_ = fVar63 * auVar12._4_4_;
  auVar221._8_4_ = fVar142 * auVar12._8_4_;
  auVar221._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar66,auVar66,0x55);
  auVar64 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar2,auVar12);
  auVar231._0_4_ = (fVar61 + auVar69._0_4_) * 0.33333334;
  auVar231._4_4_ = (fVar91 + auVar69._4_4_) * 0.33333334;
  auVar231._8_4_ = (fVar120 + auVar69._8_4_) * 0.33333334;
  auVar231._12_4_ = (fVar92 + auVar69._12_4_) * 0.33333334;
  auVar43._4_4_ = fStack_484;
  auVar43._0_4_ = local_488;
  auVar43._8_4_ = fStack_480;
  auVar43._12_4_ = fStack_47c;
  _local_458 = vsubps_avx(auVar43,auVar231);
  auVar65 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar232._0_4_ = fVar93 * auVar12._0_4_;
  auVar232._4_4_ = fVar63 * auVar12._4_4_;
  auVar232._8_4_ = fVar142 * auVar12._8_4_;
  auVar232._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar65,auVar65,0x55);
  auVar95 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar2,auVar12);
  auVar109 = vsubps_avx(auVar43,(undefined1  [16])aVar1);
  auVar12 = vshufps_avx(auVar109,auVar109,0xaa);
  auVar179._0_4_ = fVar93 * auVar12._0_4_;
  auVar179._4_4_ = fVar63 * auVar12._4_4_;
  auVar179._8_4_ = fVar142 * auVar12._8_4_;
  auVar179._12_4_ = fVar219 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar109,auVar109,0x55);
  auVar12 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar2,auVar12);
  local_4a8._0_4_ = auVar268._0_4_;
  auVar163._4_4_ = local_4a8._0_4_;
  auVar163._0_4_ = local_4a8._0_4_;
  auVar163._8_4_ = local_4a8._0_4_;
  auVar163._12_4_ = local_4a8._0_4_;
  aVar2 = (pre->ray_space).vx.field_0;
  auVar96 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar2,auVar163);
  local_4b8._0_4_ = auVar10._0_4_;
  auVar164._4_4_ = local_4b8._0_4_;
  auVar164._0_4_ = local_4b8._0_4_;
  auVar164._8_4_ = local_4b8._0_4_;
  auVar164._12_4_ = local_4b8._0_4_;
  auVar10 = vfmadd231ps_fma(auVar233,(undefined1  [16])aVar2,auVar164);
  uVar62 = auVar9._0_4_;
  auVar165._4_4_ = uVar62;
  auVar165._0_4_ = uVar62;
  auVar165._8_4_ = uVar62;
  auVar165._12_4_ = uVar62;
  auVar233 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar2,auVar165);
  uVar62 = auVar11._0_4_;
  auVar166._4_4_ = uVar62;
  auVar166._0_4_ = uVar62;
  auVar166._8_4_ = uVar62;
  auVar166._12_4_ = uVar62;
  auVar11 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar2,auVar166);
  uVar62 = auVar241._0_4_;
  auVar167._4_4_ = uVar62;
  auVar167._0_4_ = uVar62;
  auVar167._8_4_ = uVar62;
  auVar167._12_4_ = uVar62;
  auVar241 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar2,auVar167);
  uVar62 = auVar66._0_4_;
  auVar168._4_4_ = uVar62;
  auVar168._0_4_ = uVar62;
  auVar168._8_4_ = uVar62;
  auVar168._12_4_ = uVar62;
  auVar66 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar168);
  uVar62 = auVar65._0_4_;
  auVar75._4_4_ = uVar62;
  auVar75._0_4_ = uVar62;
  auVar75._8_4_ = uVar62;
  auVar75._12_4_ = uVar62;
  auVar65 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar75);
  uVar62 = auVar109._0_4_;
  auVar76._4_4_ = uVar62;
  auVar76._0_4_ = uVar62;
  auVar76._8_4_ = uVar62;
  auVar76._12_4_ = uVar62;
  auVar109 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar76);
  local_468 = vmovlhps_avx(auVar96,auVar241);
  local_4b8 = vmovlhps_avx(auVar10,auVar66);
  local_4c8 = vmovlhps_avx(auVar233,auVar65);
  _local_238 = vmovlhps_avx(auVar11,auVar109);
  auVar12 = vminps_avx(local_468,local_4b8);
  auVar9 = vminps_avx(local_4c8,_local_238);
  auVar268 = vminps_avx(auVar12,auVar9);
  auVar12 = vmaxps_avx(local_468,local_4b8);
  auVar9 = vmaxps_avx(local_4c8,_local_238);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vshufpd_avx(auVar268,auVar268,3);
  auVar268 = vminps_avx(auVar268,auVar9);
  auVar9 = vshufpd_avx(auVar12,auVar12,3);
  auVar9 = vmaxps_avx(auVar12,auVar9);
  auVar12 = vandps_avx(local_3d8,auVar268);
  auVar9 = vandps_avx(local_3d8,auVar9);
  auVar12 = vmaxps_avx(auVar12,auVar9);
  auVar9 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar9,auVar12);
  local_498 = (long)auVar59 + 0xf;
  local_198 = auVar12._0_4_ * 9.536743e-07;
  local_478 = auVar96._0_8_;
  local_388._8_8_ = auVar10._0_8_;
  local_388._0_8_ = auVar10._0_8_;
  local_398._8_8_ = auVar233._0_8_;
  local_398._0_8_ = auVar233._0_8_;
  auVar203 = ZEXT1664(local_398);
  local_3a8._8_8_ = auVar11._0_8_;
  local_3a8._0_8_ = auVar11._0_8_;
  register0x000012c8 = auVar241._0_8_;
  local_3b8 = auVar241._0_8_;
  register0x00001388 = auVar66._0_8_;
  local_3c8 = auVar66._0_8_;
  auVar174 = ZEXT1664(_local_3c8);
  _local_4a8 = ZEXT416((uint)local_198);
  local_1b8 = (uint)local_198 ^ local_3e8;
  uStack_1b4 = local_1b8;
  uStack_1b0 = local_1b8;
  uStack_1ac = local_1b8;
  uStack_1a8 = local_1b8;
  uStack_1a4 = local_1b8;
  uStack_1a0 = local_1b8;
  uStack_19c = local_1b8;
  bVar51 = false;
  uVar60 = 0;
  local_208 = vsubps_avx(local_4b8,local_468);
  local_218 = vsubps_avx(local_4c8,local_4b8);
  local_228 = vsubps_avx(_local_238,local_4c8);
  auVar218 = ZEXT1664(local_3a8);
  auVar189 = ZEXT1664(local_388);
  auVar157 = ZEXT1664(CONCAT88(local_478,local_478));
  auVar119 = ZEXT1664(_local_3b8);
  local_268 = vsubps_avx(_local_408,local_3f8);
  local_278 = vsubps_avx(_local_448,local_428);
  local_288 = vsubps_avx(_local_458,local_438);
  auVar44._4_4_ = fStack_484;
  auVar44._0_4_ = local_488;
  auVar44._8_4_ = fStack_480;
  auVar44._12_4_ = fStack_47c;
  _local_298 = vsubps_avx(auVar44,local_418);
  auVar248 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar259 = ZEXT1664(ZEXT816(0x3f80000000000000));
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_490 = prim;
  uStack_470 = local_478;
LAB_015f8d37:
  auVar95 = auVar248._0_16_;
  local_248 = auVar259._0_16_;
  auVar12 = vshufps_avx(auVar95,auVar95,0x50);
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = 0x3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar271._16_4_ = 0x3f800000;
  auVar271._0_16_ = auVar267;
  auVar271._20_4_ = 0x3f800000;
  auVar271._24_4_ = 0x3f800000;
  auVar271._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar267,auVar12);
  fVar61 = auVar12._0_4_;
  auVar77._0_4_ = auVar119._0_4_ * fVar61;
  fVar91 = auVar12._4_4_;
  auVar77._4_4_ = auVar119._4_4_ * fVar91;
  fVar120 = auVar12._8_4_;
  auVar77._8_4_ = auVar119._8_4_ * fVar120;
  fVar92 = auVar12._12_4_;
  auVar77._12_4_ = auVar119._12_4_ * fVar92;
  auVar169._0_4_ = auVar174._0_4_ * fVar61;
  auVar169._4_4_ = auVar174._4_4_ * fVar91;
  auVar169._8_4_ = auVar174._8_4_ * fVar120;
  auVar169._12_4_ = auVar174._12_4_ * fVar92;
  fVar160 = auVar65._0_4_;
  auVar134._0_4_ = fVar160 * fVar61;
  fVar238 = auVar65._4_4_;
  auVar134._4_4_ = fVar238 * fVar91;
  auVar134._8_4_ = fVar160 * fVar120;
  auVar134._12_4_ = fVar238 * fVar92;
  fVar249 = auVar109._0_4_;
  auVar110._0_4_ = fVar249 * fVar61;
  fVar250 = auVar109._4_4_;
  auVar110._4_4_ = fVar250 * fVar91;
  auVar110._8_4_ = fVar249 * fVar120;
  auVar110._12_4_ = fVar250 * fVar92;
  auVar11 = vfmadd231ps_fma(auVar77,auVar9,auVar157._0_16_);
  auVar241 = vfmadd231ps_fma(auVar169,auVar9,auVar189._0_16_);
  auVar66 = vfmadd231ps_fma(auVar134,auVar9,auVar203._0_16_);
  auVar96 = vfmadd231ps_fma(auVar110,auVar218._0_16_,auVar9);
  auVar12 = vmovshdup_avx(auVar259._0_16_);
  fVar61 = auVar259._0_4_;
  fStack_e0 = (auVar12._0_4_ - fVar61) * 0.04761905;
  auVar217._4_4_ = fVar61;
  auVar217._0_4_ = fVar61;
  auVar217._8_4_ = fVar61;
  auVar217._12_4_ = fVar61;
  auVar217._16_4_ = fVar61;
  auVar217._20_4_ = fVar61;
  auVar217._24_4_ = fVar61;
  auVar217._28_4_ = fVar61;
  auVar106._0_8_ = auVar12._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar88 = vsubps_avx(auVar106,auVar217);
  uVar62 = auVar11._0_4_;
  auVar265._4_4_ = uVar62;
  auVar265._0_4_ = uVar62;
  auVar265._8_4_ = uVar62;
  auVar265._12_4_ = uVar62;
  auVar265._16_4_ = uVar62;
  auVar265._20_4_ = uVar62;
  auVar265._24_4_ = uVar62;
  auVar265._28_4_ = uVar62;
  auVar12 = vmovshdup_avx(auVar11);
  uVar94 = auVar12._0_8_;
  auVar258._8_8_ = uVar94;
  auVar258._0_8_ = uVar94;
  auVar258._16_8_ = uVar94;
  auVar258._24_8_ = uVar94;
  fVar175 = auVar241._0_4_;
  auVar245._4_4_ = fVar175;
  auVar245._0_4_ = fVar175;
  auVar245._8_4_ = fVar175;
  auVar245._12_4_ = fVar175;
  auVar245._16_4_ = fVar175;
  auVar245._20_4_ = fVar175;
  auVar245._24_4_ = fVar175;
  auVar245._28_4_ = fVar175;
  auVar9 = vmovshdup_avx(auVar241);
  auVar107._0_8_ = auVar9._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar219 = auVar66._0_4_;
  auVar186._4_4_ = fVar219;
  auVar186._0_4_ = fVar219;
  auVar186._8_4_ = fVar219;
  auVar186._12_4_ = fVar219;
  auVar186._16_4_ = fVar219;
  auVar186._20_4_ = fVar219;
  auVar186._24_4_ = fVar219;
  auVar186._28_4_ = fVar219;
  auVar268 = vmovshdup_avx(auVar66);
  auVar201._0_8_ = auVar268._0_8_;
  auVar201._8_8_ = auVar201._0_8_;
  auVar201._16_8_ = auVar201._0_8_;
  auVar201._24_8_ = auVar201._0_8_;
  fVar142 = auVar96._0_4_;
  auVar10 = vmovshdup_avx(auVar96);
  auVar233 = vfmadd132ps_fma(auVar88,auVar217,_DAT_01faff20);
  auVar88 = vsubps_avx(auVar271,ZEXT1632(auVar233));
  fVar61 = auVar233._0_4_;
  fVar91 = auVar233._4_4_;
  auVar13._4_4_ = fVar175 * fVar91;
  auVar13._0_4_ = fVar175 * fVar61;
  fVar120 = auVar233._8_4_;
  auVar13._8_4_ = fVar175 * fVar120;
  fVar92 = auVar233._12_4_;
  auVar13._12_4_ = fVar175 * fVar92;
  auVar13._16_4_ = fVar175 * 0.0;
  auVar13._20_4_ = fVar175 * 0.0;
  auVar13._24_4_ = fVar175 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar233 = vfmadd231ps_fma(auVar13,auVar88,auVar265);
  fVar93 = auVar9._0_4_;
  fVar63 = auVar9._4_4_;
  auVar14._4_4_ = fVar63 * fVar91;
  auVar14._0_4_ = fVar93 * fVar61;
  auVar14._8_4_ = fVar93 * fVar120;
  auVar14._12_4_ = fVar63 * fVar92;
  auVar14._16_4_ = fVar93 * 0.0;
  auVar14._20_4_ = fVar63 * 0.0;
  auVar14._24_4_ = fVar93 * 0.0;
  auVar14._28_4_ = uVar62;
  auVar97 = vfmadd231ps_fma(auVar14,auVar88,auVar258);
  auVar15._4_4_ = fVar219 * fVar91;
  auVar15._0_4_ = fVar219 * fVar61;
  auVar15._8_4_ = fVar219 * fVar120;
  auVar15._12_4_ = fVar219 * fVar92;
  auVar15._16_4_ = fVar219 * 0.0;
  auVar15._20_4_ = fVar219 * 0.0;
  auVar15._24_4_ = fVar219 * 0.0;
  auVar15._28_4_ = auVar12._4_4_;
  auVar121 = vfmadd231ps_fma(auVar15,auVar88,auVar245);
  fVar93 = auVar268._0_4_;
  fVar63 = auVar268._4_4_;
  auVar8._4_4_ = fVar63 * fVar91;
  auVar8._0_4_ = fVar93 * fVar61;
  auVar8._8_4_ = fVar93 * fVar120;
  auVar8._12_4_ = fVar63 * fVar92;
  auVar8._16_4_ = fVar93 * 0.0;
  auVar8._20_4_ = fVar63 * 0.0;
  auVar8._24_4_ = fVar93 * 0.0;
  auVar8._28_4_ = fVar175;
  auVar124 = vfmadd231ps_fma(auVar8,auVar88,auVar107);
  auVar12 = vshufps_avx(auVar11,auVar11,0xaa);
  local_4e8._8_8_ = auVar12._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  auVar9 = vshufps_avx(auVar11,auVar11,0xff);
  uStack_500 = auVar9._0_8_;
  local_508 = (undefined1  [8])uStack_500;
  uStack_4f8 = uStack_500;
  uStack_4f0 = uStack_500;
  auVar16._4_4_ = fVar142 * fVar91;
  auVar16._0_4_ = fVar142 * fVar61;
  auVar16._8_4_ = fVar142 * fVar120;
  auVar16._12_4_ = fVar142 * fVar92;
  auVar16._16_4_ = fVar142 * 0.0;
  auVar16._20_4_ = fVar142 * 0.0;
  auVar16._24_4_ = fVar142 * 0.0;
  auVar16._28_4_ = fVar142;
  auVar11 = vfmadd231ps_fma(auVar16,auVar88,auVar186);
  auVar9 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar187._0_8_ = auVar9._0_8_;
  auVar187._8_8_ = auVar187._0_8_;
  auVar187._16_8_ = auVar187._0_8_;
  auVar187._24_8_ = auVar187._0_8_;
  auVar268 = vshufps_avx(auVar241,auVar241,0xff);
  local_368._8_8_ = auVar268._0_8_;
  local_368._0_8_ = local_368._8_8_;
  local_368._16_8_ = local_368._8_8_;
  local_368._24_8_ = local_368._8_8_;
  fVar93 = auVar10._0_4_;
  fVar63 = auVar10._4_4_;
  auVar247._4_4_ = fVar63 * fVar91;
  auVar247._0_4_ = fVar93 * fVar61;
  auVar247._8_4_ = fVar93 * fVar120;
  auVar247._12_4_ = fVar63 * fVar92;
  auVar247._16_4_ = fVar93 * 0.0;
  auVar247._20_4_ = fVar63 * 0.0;
  auVar247._24_4_ = fVar93 * 0.0;
  auVar247._28_4_ = auVar12._4_4_;
  auVar64 = vfmadd231ps_fma(auVar247,auVar88,auVar201);
  auVar18._28_4_ = fVar63;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar121._12_4_ * fVar92,
                          CONCAT48(auVar121._8_4_ * fVar120,
                                   CONCAT44(auVar121._4_4_ * fVar91,auVar121._0_4_ * fVar61))));
  auVar233 = vfmadd231ps_fma(auVar18,auVar88,ZEXT1632(auVar233));
  fVar93 = auVar268._4_4_;
  auVar19._28_4_ = fVar93;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar92,
                          CONCAT48(auVar124._8_4_ * fVar120,
                                   CONCAT44(auVar124._4_4_ * fVar91,auVar124._0_4_ * fVar61))));
  auVar97 = vfmadd231ps_fma(auVar19,auVar88,ZEXT1632(auVar97));
  auVar12 = vshufps_avx(auVar66,auVar66,0xaa);
  uVar94 = auVar12._0_8_;
  auVar173._8_8_ = uVar94;
  auVar173._0_8_ = uVar94;
  auVar173._16_8_ = uVar94;
  auVar173._24_8_ = uVar94;
  auVar10 = vshufps_avx(auVar66,auVar66,0xff);
  uVar94 = auVar10._0_8_;
  auVar272._8_8_ = uVar94;
  auVar272._0_8_ = uVar94;
  auVar272._16_8_ = uVar94;
  auVar272._24_8_ = uVar94;
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                               CONCAT48(auVar11._8_4_ * fVar120,
                                                        CONCAT44(auVar11._4_4_ * fVar91,
                                                                 auVar11._0_4_ * fVar61)))),auVar88,
                            ZEXT1632(auVar121));
  auVar11 = vshufps_avx(auVar96,auVar96,0xaa);
  auVar241 = vshufps_avx(auVar96,auVar96,0xff);
  auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar64._12_4_,
                                               CONCAT48(fVar120 * auVar64._8_4_,
                                                        CONCAT44(fVar91 * auVar64._4_4_,
                                                                 fVar61 * auVar64._0_4_)))),auVar88,
                            ZEXT1632(auVar124));
  auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar66._12_4_,
                                                CONCAT48(fVar120 * auVar66._8_4_,
                                                         CONCAT44(fVar91 * auVar66._4_4_,
                                                                  fVar61 * auVar66._0_4_)))),auVar88
                             ,ZEXT1632(auVar233));
  auVar13 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar233));
  auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar96._12_4_,
                                               CONCAT48(fVar120 * auVar96._8_4_,
                                                        CONCAT44(fVar91 * auVar96._4_4_,
                                                                 fVar61 * auVar96._0_4_)))),auVar88,
                            ZEXT1632(auVar97));
  auVar14 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar97));
  fStack_2fc = auVar14._28_4_;
  auVar246._0_4_ = fStack_e0 * auVar13._0_4_ * 3.0;
  auVar246._4_4_ = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar246._8_4_ = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar246._12_4_ = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar246._16_4_ = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar246._20_4_ = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar246._24_4_ = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar246._28_4_ = 0;
  local_318._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  local_318._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  fStack_310 = fStack_e0 * auVar14._8_4_ * 3.0;
  fStack_30c = fStack_e0 * auVar14._12_4_ * 3.0;
  fStack_308 = fStack_e0 * auVar14._16_4_ * 3.0;
  fStack_304 = fStack_e0 * auVar14._20_4_ * 3.0;
  fStack_300 = fStack_e0 * auVar14._24_4_ * 3.0;
  fVar63 = auVar9._0_4_;
  fVar142 = auVar9._4_4_;
  auVar20._4_4_ = fVar142 * fVar91;
  auVar20._0_4_ = fVar63 * fVar61;
  auVar20._8_4_ = fVar63 * fVar120;
  auVar20._12_4_ = fVar142 * fVar92;
  auVar20._16_4_ = fVar63 * 0.0;
  auVar20._20_4_ = fVar142 * 0.0;
  auVar20._24_4_ = fVar63 * 0.0;
  auVar20._28_4_ = fStack_2fc;
  auVar9 = vfmadd231ps_fma(auVar20,auVar88,local_4e8);
  fVar63 = auVar268._0_4_;
  auVar21._4_4_ = fVar93 * fVar91;
  auVar21._0_4_ = fVar63 * fVar61;
  auVar21._8_4_ = fVar63 * fVar120;
  auVar21._12_4_ = fVar93 * fVar92;
  auVar21._16_4_ = fVar63 * 0.0;
  auVar21._20_4_ = fVar93 * 0.0;
  auVar21._24_4_ = fVar63 * 0.0;
  auVar21._28_4_ = 0;
  auVar268 = vfmadd231ps_fma(auVar21,auVar88,_local_508);
  fVar93 = auVar12._0_4_;
  fVar63 = auVar12._4_4_;
  auVar22._4_4_ = fVar63 * fVar91;
  auVar22._0_4_ = fVar93 * fVar61;
  auVar22._8_4_ = fVar93 * fVar120;
  auVar22._12_4_ = fVar63 * fVar92;
  auVar22._16_4_ = fVar93 * 0.0;
  auVar22._20_4_ = fVar63 * 0.0;
  auVar22._24_4_ = fVar93 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar12 = vfmadd231ps_fma(auVar22,auVar88,auVar187);
  fVar93 = auVar10._0_4_;
  fVar219 = auVar10._4_4_;
  auVar23._4_4_ = fVar219 * fVar91;
  auVar23._0_4_ = fVar93 * fVar61;
  auVar23._8_4_ = fVar93 * fVar120;
  auVar23._12_4_ = fVar219 * fVar92;
  auVar23._16_4_ = fVar93 * 0.0;
  auVar23._20_4_ = fVar219 * 0.0;
  auVar23._24_4_ = fVar93 * 0.0;
  auVar23._28_4_ = fVar142;
  auVar10 = vfmadd231ps_fma(auVar23,auVar88,local_368);
  local_368 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar121));
  fVar93 = auVar11._0_4_;
  fVar63 = auVar11._4_4_;
  auVar24._4_4_ = fVar63 * fVar91;
  auVar24._0_4_ = fVar93 * fVar61;
  auVar24._8_4_ = fVar93 * fVar120;
  auVar24._12_4_ = fVar63 * fVar92;
  auVar24._16_4_ = fVar93 * 0.0;
  auVar24._20_4_ = fVar63 * 0.0;
  auVar24._24_4_ = fVar93 * 0.0;
  auVar24._28_4_ = fVar63;
  auVar11 = vfmadd231ps_fma(auVar24,auVar88,auVar173);
  _local_508 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar66));
  fVar93 = auVar241._0_4_;
  fVar63 = auVar241._4_4_;
  auVar25._4_4_ = fVar63 * fVar91;
  auVar25._0_4_ = fVar93 * fVar61;
  auVar25._8_4_ = fVar93 * fVar120;
  auVar25._12_4_ = fVar63 * fVar92;
  auVar25._16_4_ = fVar93 * 0.0;
  auVar25._20_4_ = fVar63 * 0.0;
  auVar25._24_4_ = fVar93 * 0.0;
  auVar25._28_4_ = fVar63;
  auVar241 = vfmadd231ps_fma(auVar25,auVar88,auVar272);
  auVar26._28_4_ = fVar219;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar92,
                          CONCAT48(auVar12._8_4_ * fVar120,
                                   CONCAT44(auVar12._4_4_ * fVar91,auVar12._0_4_ * fVar61))));
  auVar9 = vfmadd231ps_fma(auVar26,auVar88,ZEXT1632(auVar9));
  auVar268 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar10._12_4_,
                                                CONCAT48(fVar120 * auVar10._8_4_,
                                                         CONCAT44(fVar91 * auVar10._4_4_,
                                                                  fVar61 * auVar10._0_4_)))),auVar88
                             ,ZEXT1632(auVar268));
  local_4e8._0_4_ = auVar121._0_4_ + auVar246._0_4_;
  local_4e8._4_4_ = auVar121._4_4_ + auVar246._4_4_;
  local_4e8._8_4_ = auVar121._8_4_ + auVar246._8_4_;
  local_4e8._12_4_ = auVar121._12_4_ + auVar246._12_4_;
  local_4e8._16_4_ = auVar246._16_4_ + 0.0;
  local_4e8._20_4_ = auVar246._20_4_ + 0.0;
  local_4e8._24_4_ = auVar246._24_4_ + 0.0;
  local_4e8._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar92,
                                               CONCAT48(auVar11._8_4_ * fVar120,
                                                        CONCAT44(auVar11._4_4_ * fVar91,
                                                                 auVar11._0_4_ * fVar61)))),auVar88,
                            ZEXT1632(auVar12));
  auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar92,
                                               CONCAT48(auVar241._8_4_ * fVar120,
                                                        CONCAT44(auVar241._4_4_ * fVar91,
                                                                 auVar241._0_4_ * fVar61)))),auVar88
                            ,ZEXT1632(auVar10));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar92 * auVar12._12_4_,
                                               CONCAT48(fVar120 * auVar12._8_4_,
                                                        CONCAT44(fVar91 * auVar12._4_4_,
                                                                 fVar61 * auVar12._0_4_)))),auVar88,
                            ZEXT1632(auVar9));
  auVar241 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar10._12_4_ * fVar92,
                                                CONCAT48(auVar10._8_4_ * fVar120,
                                                         CONCAT44(auVar10._4_4_ * fVar91,
                                                                  auVar10._0_4_ * fVar61)))),
                             ZEXT1632(auVar268),auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar13 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar268));
  auVar266._0_4_ = fStack_e0 * auVar88._0_4_ * 3.0;
  auVar266._4_4_ = fStack_e0 * auVar88._4_4_ * 3.0;
  auVar266._8_4_ = fStack_e0 * auVar88._8_4_ * 3.0;
  auVar266._12_4_ = fStack_e0 * auVar88._12_4_ * 3.0;
  auVar266._16_4_ = fStack_e0 * auVar88._16_4_ * 3.0;
  auVar266._20_4_ = fStack_e0 * auVar88._20_4_ * 3.0;
  auVar266._24_4_ = fStack_e0 * auVar88._24_4_ * 3.0;
  auVar266._28_4_ = 0;
  local_f8 = fStack_e0 * auVar13._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_f4;
  auVar27._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_e0;
  auVar27._28_4_ = 0x40400000;
  _local_2f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar11));
  local_1d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar241));
  auVar88 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar121));
  auVar13 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar66));
  auVar14 = vsubps_avx(_local_2f8,local_368);
  fVar175 = auVar88._0_4_ + auVar14._0_4_;
  fVar190 = auVar88._4_4_ + auVar14._4_4_;
  fVar191 = auVar88._8_4_ + auVar14._8_4_;
  fVar192 = auVar88._12_4_ + auVar14._12_4_;
  fVar141 = auVar88._16_4_ + auVar14._16_4_;
  fVar158 = auVar88._20_4_ + auVar14._20_4_;
  fVar159 = auVar88._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_1d8,_local_508);
  auVar89._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar89._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar89._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar89._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar89._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar89._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar89._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar89._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_98 = ZEXT1632(auVar66);
  fVar61 = auVar66._0_4_;
  local_118 = (float)local_318._0_4_ + fVar61;
  fVar91 = auVar66._4_4_;
  fStack_114 = (float)local_318._4_4_ + fVar91;
  fVar120 = auVar66._8_4_;
  fStack_110 = fStack_310 + fVar120;
  fVar92 = auVar66._12_4_;
  fStack_10c = fStack_30c + fVar92;
  fStack_108 = fStack_308 + 0.0;
  fStack_104 = fStack_304 + 0.0;
  fStack_100 = fStack_300 + 0.0;
  local_1f8 = ZEXT1632(auVar121);
  auVar13 = vsubps_avx(local_1f8,auVar246);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar13 = vsubps_avx(local_98,_local_318);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar13);
  local_b8._0_4_ = auVar11._0_4_ + auVar266._0_4_;
  local_b8._4_4_ = auVar11._4_4_ + auVar266._4_4_;
  local_b8._8_4_ = auVar11._8_4_ + auVar266._8_4_;
  local_b8._12_4_ = auVar11._12_4_ + auVar266._12_4_;
  local_b8._16_4_ = auVar266._16_4_ + 0.0;
  local_b8._20_4_ = auVar266._20_4_ + 0.0;
  local_b8._24_4_ = auVar266._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar119 = ZEXT3264(local_b8);
  auVar247 = ZEXT1632(auVar11);
  auVar13 = vsubps_avx(auVar247,auVar266);
  auVar16 = vpermps_avx2(_DAT_01fec480,auVar13);
  fVar93 = auVar241._0_4_;
  local_f8 = fVar93 + local_f8;
  fVar63 = auVar241._4_4_;
  fStack_f4 = fVar63 + fStack_f4;
  fVar142 = auVar241._8_4_;
  fStack_f0 = fVar142 + fStack_f0;
  fVar219 = auVar241._12_4_;
  fStack_ec = fVar219 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar241),auVar27);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar28._4_4_ = fVar91 * fVar190;
  auVar28._0_4_ = fVar61 * fVar175;
  auVar28._8_4_ = fVar120 * fVar191;
  auVar28._12_4_ = fVar92 * fVar192;
  auVar28._16_4_ = fVar141 * 0.0;
  auVar28._20_4_ = fVar158 * 0.0;
  auVar28._24_4_ = fVar159 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar28,local_1f8,auVar89);
  fStack_fc = fStack_2fc + 0.0;
  auVar29._4_4_ = fStack_114 * fVar190;
  auVar29._0_4_ = local_118 * fVar175;
  auVar29._8_4_ = fStack_110 * fVar191;
  auVar29._12_4_ = fStack_10c * fVar192;
  auVar29._16_4_ = fStack_108 * fVar141;
  auVar29._20_4_ = fStack_104 * fVar158;
  auVar29._24_4_ = fStack_100 * fVar159;
  auVar29._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar29,auVar89,local_4e8);
  auVar30._4_4_ = local_138._4_4_ * fVar190;
  auVar30._0_4_ = local_138._0_4_ * fVar175;
  auVar30._8_4_ = local_138._8_4_ * fVar191;
  auVar30._12_4_ = local_138._12_4_ * fVar192;
  auVar30._16_4_ = local_138._16_4_ * fVar141;
  auVar30._20_4_ = local_138._20_4_ * fVar158;
  auVar30._24_4_ = local_138._24_4_ * fVar159;
  auVar30._28_4_ = fStack_2fc + 0.0;
  auVar268 = vfnmadd231ps_fma(auVar30,local_78,auVar89);
  auVar31._4_4_ = (float)local_508._4_4_ * fVar190;
  auVar31._0_4_ = (float)local_508._0_4_ * fVar175;
  auVar31._8_4_ = (float)uStack_500 * fVar191;
  auVar31._12_4_ = uStack_500._4_4_ * fVar192;
  auVar31._16_4_ = (float)uStack_4f8 * fVar141;
  auVar31._20_4_ = uStack_4f8._4_4_ * fVar158;
  auVar31._24_4_ = (float)uStack_4f0 * fVar159;
  auVar31._28_4_ = uStack_4f0._4_4_;
  auVar10 = vfnmadd231ps_fma(auVar31,local_368,auVar89);
  auVar202._0_4_ = fVar93 * fVar175;
  auVar202._4_4_ = fVar63 * fVar190;
  auVar202._8_4_ = fVar142 * fVar191;
  auVar202._12_4_ = fVar219 * fVar192;
  auVar202._16_4_ = fVar141 * 0.0;
  auVar202._20_4_ = fVar158 * 0.0;
  auVar202._24_4_ = fVar159 * 0.0;
  auVar202._28_4_ = 0;
  auVar11 = vfnmadd231ps_fma(auVar202,auVar247,auVar89);
  uStack_dc = 0x40400000;
  auVar32._4_4_ = fStack_f4 * fVar190;
  auVar32._0_4_ = local_f8 * fVar175;
  auVar32._8_4_ = fStack_f0 * fVar191;
  auVar32._12_4_ = fStack_ec * fVar192;
  auVar32._16_4_ = fStack_e8 * fVar141;
  auVar32._20_4_ = fStack_e4 * fVar158;
  auVar32._24_4_ = fStack_e0 * fVar159;
  auVar32._28_4_ = local_368._28_4_;
  auVar66 = vfnmadd231ps_fma(auVar32,local_b8,auVar89);
  auVar33._4_4_ = local_d8._4_4_ * fVar190;
  auVar33._0_4_ = local_d8._0_4_ * fVar175;
  auVar33._8_4_ = local_d8._8_4_ * fVar191;
  auVar33._12_4_ = local_d8._12_4_ * fVar192;
  auVar33._16_4_ = local_d8._16_4_ * fVar141;
  auVar33._20_4_ = local_d8._20_4_ * fVar158;
  auVar33._24_4_ = local_d8._24_4_ * fVar159;
  auVar33._28_4_ = local_d8._28_4_;
  auVar96 = vfnmadd231ps_fma(auVar33,auVar16,auVar89);
  auVar34._4_4_ = local_1d8._4_4_ * fVar190;
  auVar34._0_4_ = local_1d8._0_4_ * fVar175;
  auVar34._8_4_ = local_1d8._8_4_ * fVar191;
  auVar34._12_4_ = local_1d8._12_4_ * fVar192;
  auVar34._16_4_ = local_1d8._16_4_ * fVar141;
  auVar34._20_4_ = local_1d8._20_4_ * fVar158;
  auVar34._24_4_ = local_1d8._24_4_ * fVar159;
  auVar34._28_4_ = auVar88._28_4_ + auVar14._28_4_;
  auVar233 = vfnmadd231ps_fma(auVar34,_local_2f8,auVar89);
  auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar88 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar9));
  auVar14 = vminps_avx(ZEXT1632(auVar268),ZEXT1632(auVar10));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar268),ZEXT1632(auVar10));
  auVar88 = vmaxps_avx(auVar88,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar66));
  auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar66));
  auVar8 = vminps_avx(ZEXT1632(auVar96),ZEXT1632(auVar233));
  auVar15 = vminps_avx(auVar15,auVar8);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar96),ZEXT1632(auVar233));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar88,auVar13);
  auVar49._4_4_ = fStack_194;
  auVar49._0_4_ = local_198;
  auVar49._8_4_ = fStack_190;
  auVar49._12_4_ = fStack_18c;
  auVar49._16_4_ = fStack_188;
  auVar49._20_4_ = fStack_184;
  auVar49._24_4_ = fStack_180;
  auVar49._28_4_ = fStack_17c;
  auVar88 = vcmpps_avx(auVar15,auVar49,2);
  auVar47._4_4_ = uStack_1b4;
  auVar47._0_4_ = local_1b8;
  auVar47._8_4_ = uStack_1b0;
  auVar47._12_4_ = uStack_1ac;
  auVar47._16_4_ = uStack_1a8;
  auVar47._20_4_ = uStack_1a4;
  auVar47._24_4_ = uStack_1a0;
  auVar47._28_4_ = uStack_19c;
  auVar13 = vcmpps_avx(auVar13,auVar47,5);
  auVar88 = vandps_avx(auVar13,auVar88);
  auVar13 = local_158 & auVar88;
  _local_318 = auVar16;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_368,local_1f8);
    auVar14 = vsubps_avx(_local_2f8,auVar247);
    fVar190 = auVar13._0_4_ + auVar14._0_4_;
    fVar191 = auVar13._4_4_ + auVar14._4_4_;
    fVar192 = auVar13._8_4_ + auVar14._8_4_;
    fVar141 = auVar13._12_4_ + auVar14._12_4_;
    fVar158 = auVar13._16_4_ + auVar14._16_4_;
    fVar159 = auVar13._20_4_ + auVar14._20_4_;
    fVar251 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_508,local_98);
    auVar8 = vsubps_avx(local_1d8,ZEXT1632(auVar241));
    auVar108._0_4_ = auVar15._0_4_ + auVar8._0_4_;
    auVar108._4_4_ = auVar15._4_4_ + auVar8._4_4_;
    auVar108._8_4_ = auVar15._8_4_ + auVar8._8_4_;
    auVar108._12_4_ = auVar15._12_4_ + auVar8._12_4_;
    auVar108._16_4_ = auVar15._16_4_ + auVar8._16_4_;
    auVar108._20_4_ = auVar15._20_4_ + auVar8._20_4_;
    auVar108._24_4_ = auVar15._24_4_ + auVar8._24_4_;
    fVar175 = auVar8._28_4_;
    auVar108._28_4_ = auVar15._28_4_ + fVar175;
    auVar35._4_4_ = fVar91 * fVar191;
    auVar35._0_4_ = fVar61 * fVar190;
    auVar35._8_4_ = fVar120 * fVar192;
    auVar35._12_4_ = fVar92 * fVar141;
    auVar35._16_4_ = fVar158 * 0.0;
    auVar35._20_4_ = fVar159 * 0.0;
    auVar35._24_4_ = fVar251 * 0.0;
    auVar35._28_4_ = local_2f8._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar35,auVar108,local_1f8);
    auVar36._4_4_ = fVar191 * fStack_114;
    auVar36._0_4_ = fVar190 * local_118;
    auVar36._8_4_ = fVar192 * fStack_110;
    auVar36._12_4_ = fVar141 * fStack_10c;
    auVar36._16_4_ = fVar158 * fStack_108;
    auVar36._20_4_ = fVar159 * fStack_104;
    auVar36._24_4_ = fVar251 * fStack_100;
    auVar36._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_4e8,auVar108,auVar36);
    auVar37._4_4_ = fVar191 * local_138._4_4_;
    auVar37._0_4_ = fVar190 * local_138._0_4_;
    auVar37._8_4_ = fVar192 * local_138._8_4_;
    auVar37._12_4_ = fVar141 * local_138._12_4_;
    auVar37._16_4_ = fVar158 * local_138._16_4_;
    auVar37._20_4_ = fVar159 * local_138._20_4_;
    auVar37._24_4_ = fVar251 * local_138._24_4_;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_78,auVar108,auVar37);
    auVar38._4_4_ = (float)local_508._4_4_ * fVar191;
    auVar38._0_4_ = (float)local_508._0_4_ * fVar190;
    auVar38._8_4_ = (float)uStack_500 * fVar192;
    auVar38._12_4_ = uStack_500._4_4_ * fVar141;
    auVar38._16_4_ = (float)uStack_4f8 * fVar158;
    auVar38._20_4_ = uStack_4f8._4_4_ * fVar159;
    auVar38._24_4_ = (float)uStack_4f0 * fVar251;
    auVar38._28_4_ = 0;
    auVar241 = vfnmadd231ps_fma(auVar38,auVar108,local_368);
    auVar130._0_4_ = fVar93 * fVar190;
    auVar130._4_4_ = fVar63 * fVar191;
    auVar130._8_4_ = fVar142 * fVar192;
    auVar130._12_4_ = fVar219 * fVar141;
    auVar130._16_4_ = fVar158 * 0.0;
    auVar130._20_4_ = fVar159 * 0.0;
    auVar130._24_4_ = fVar251 * 0.0;
    auVar130._28_4_ = 0;
    auVar66 = vfnmadd231ps_fma(auVar130,auVar108,auVar247);
    auVar39._4_4_ = fVar191 * fStack_f4;
    auVar39._0_4_ = fVar190 * local_f8;
    auVar39._8_4_ = fVar192 * fStack_f0;
    auVar39._12_4_ = fVar141 * fStack_ec;
    auVar39._16_4_ = fVar158 * fStack_e8;
    auVar39._20_4_ = fVar159 * fStack_e4;
    auVar39._24_4_ = fVar251 * fStack_e0;
    auVar39._28_4_ = fVar175;
    auVar268 = vfnmadd213ps_fma(local_b8,auVar108,auVar39);
    auVar40._4_4_ = fVar191 * local_d8._4_4_;
    auVar40._0_4_ = fVar190 * local_d8._0_4_;
    auVar40._8_4_ = fVar192 * local_d8._8_4_;
    auVar40._12_4_ = fVar141 * local_d8._12_4_;
    auVar40._16_4_ = fVar158 * local_d8._16_4_;
    auVar40._20_4_ = fVar159 * local_d8._20_4_;
    auVar40._24_4_ = fVar251 * local_d8._24_4_;
    auVar40._28_4_ = fVar175;
    auVar10 = vfnmadd213ps_fma(auVar16,auVar108,auVar40);
    auVar119 = ZEXT1664(auVar10);
    auVar41._4_4_ = local_1d8._4_4_ * fVar191;
    auVar41._0_4_ = local_1d8._0_4_ * fVar190;
    auVar41._8_4_ = local_1d8._8_4_ * fVar192;
    auVar41._12_4_ = local_1d8._12_4_ * fVar141;
    auVar41._16_4_ = local_1d8._16_4_ * fVar158;
    auVar41._20_4_ = local_1d8._20_4_ * fVar159;
    auVar41._24_4_ = local_1d8._24_4_ * fVar251;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar96 = vfnmadd231ps_fma(auVar41,_local_2f8,auVar108);
    auVar14 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar13 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
    auVar15 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar241));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar241));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar8 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar268));
    auVar14 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar268));
    auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96));
    auVar8 = vminps_avx(auVar8,auVar16);
    auVar8 = vminps_avx(auVar15,auVar8);
    auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar96));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar13 = vcmpps_avx(auVar8,auVar50,2);
    auVar48._4_4_ = uStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = uStack_1b0;
    auVar48._12_4_ = uStack_1ac;
    auVar48._16_4_ = uStack_1a8;
    auVar48._20_4_ = uStack_1a4;
    auVar48._24_4_ = uStack_1a0;
    auVar48._28_4_ = uStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar48,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar88 = vandps_avx(local_158,auVar88);
    auVar14 = auVar88 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar13,auVar88);
      uVar58 = vmovmskps_avx(auVar88);
      if (uVar58 != 0) {
        uVar57 = (ulong)uVar60;
        auStack_2d8[uVar57] = uVar58 & 0xff;
        uVar94 = vmovlps_avx(local_248);
        *(undefined8 *)(&uStack_178 + uVar57 * 2) = uVar94;
        uVar53 = vmovlps_avx(auVar95);
        auStack_58[uVar57] = uVar53;
        uVar60 = uVar60 + 1;
      }
    }
  }
LAB_015f92b2:
  local_348.valid = &local_51c;
  if (uVar60 != 0) {
    uVar57 = (ulong)(uVar60 - 1);
    uVar55 = auStack_2d8[uVar57];
    uVar58 = (&uStack_178)[uVar57 * 2];
    fVar61 = afStack_174[uVar57 * 2];
    iVar17 = 0;
    for (uVar53 = (ulong)uVar55; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
      iVar17 = iVar17 + 1;
    }
    uVar55 = uVar55 - 1 & uVar55;
    if (uVar55 == 0) {
      uVar60 = uVar60 - 1;
    }
    auVar240._8_8_ = 0;
    auVar240._0_8_ = auStack_58[uVar57];
    auVar248 = ZEXT1664(auVar240);
    auStack_2d8[uVar57] = uVar55;
    fVar91 = (float)(iVar17 + 1) * 0.14285715;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * (float)iVar17 * 0.14285715)),ZEXT416(uVar58),
                              ZEXT416((uint)(1.0 - (float)iVar17 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar91)),ZEXT416(uVar58),
                             ZEXT416((uint)(1.0 - fVar91)));
    fVar91 = auVar9._0_4_;
    auVar188._0_4_ = auVar12._0_4_;
    fVar61 = fVar91 - auVar188._0_4_;
    if (fVar61 < 0.16666667) {
      auVar268 = vshufps_avx(auVar240,auVar240,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar99,auVar268);
      fVar120 = auVar268._0_4_;
      auVar135._0_4_ = fVar120 * (float)local_3b8._0_4_;
      fVar92 = auVar268._4_4_;
      auVar135._4_4_ = fVar92 * (float)local_3b8._4_4_;
      fVar93 = auVar268._8_4_;
      auVar135._8_4_ = fVar93 * fStack_3b0;
      fVar63 = auVar268._12_4_;
      auVar135._12_4_ = fVar63 * fStack_3ac;
      auVar148._0_4_ = fVar120 * (float)local_3c8._0_4_;
      auVar148._4_4_ = fVar92 * (float)local_3c8._4_4_;
      auVar148._8_4_ = fVar93 * fStack_3c0;
      auVar148._12_4_ = fVar63 * fStack_3bc;
      auVar170._0_4_ = fVar160 * fVar120;
      auVar170._4_4_ = fVar238 * fVar92;
      auVar170._8_4_ = fVar160 * fVar93;
      auVar170._12_4_ = fVar238 * fVar63;
      auVar78._0_4_ = fVar249 * fVar120;
      auVar78._4_4_ = fVar250 * fVar92;
      auVar78._8_4_ = fVar249 * fVar93;
      auVar78._12_4_ = fVar250 * fVar63;
      auVar46._8_8_ = uStack_470;
      auVar46._0_8_ = local_478;
      auVar268 = vfmadd231ps_fma(auVar135,auVar10,auVar46);
      auVar11 = vfmadd231ps_fma(auVar148,auVar10,local_388);
      auVar241 = vfmadd231ps_fma(auVar170,auVar10,local_398);
      auVar10 = vfmadd231ps_fma(auVar78,auVar10,local_3a8);
      auVar131._16_16_ = auVar268;
      auVar131._0_16_ = auVar268;
      auVar140._16_16_ = auVar11;
      auVar140._0_16_ = auVar11;
      auVar156._16_16_ = auVar241;
      auVar156._0_16_ = auVar241;
      _local_508 = auVar12;
      auVar188._4_4_ = auVar188._0_4_;
      auVar188._8_4_ = auVar188._0_4_;
      auVar188._12_4_ = auVar188._0_4_;
      local_4e8._0_16_ = auVar9;
      auVar188._20_4_ = fVar91;
      auVar188._16_4_ = fVar91;
      auVar188._24_4_ = fVar91;
      auVar188._28_4_ = fVar91;
      auVar88 = vsubps_avx(auVar140,auVar131);
      auVar11 = vfmadd213ps_fma(auVar88,auVar188,auVar131);
      auVar88 = vsubps_avx(auVar156,auVar140);
      auVar66 = vfmadd213ps_fma(auVar88,auVar188,auVar140);
      auVar268 = vsubps_avx(auVar10,auVar241);
      auVar90._16_16_ = auVar268;
      auVar90._0_16_ = auVar268;
      auVar268 = vfmadd213ps_fma(auVar90,auVar188,auVar156);
      auVar88 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar88,auVar188,ZEXT1632(auVar11));
      auVar88 = vsubps_avx(ZEXT1632(auVar268),ZEXT1632(auVar66));
      auVar268 = vfmadd213ps_fma(auVar88,auVar188,ZEXT1632(auVar66));
      auVar88 = vsubps_avx(ZEXT1632(auVar268),ZEXT1632(auVar10));
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar88,auVar188);
      fVar219 = auVar88._4_4_ * 3.0;
      local_368._0_4_ = fVar61;
      fVar120 = fVar61 * 0.33333334;
      local_1d8._0_8_ =
           CONCAT44(auVar97._4_4_ + fVar120 * fVar219,auVar97._0_4_ + fVar120 * auVar88._0_4_ * 3.0)
      ;
      local_1d8._8_4_ = auVar97._8_4_ + fVar120 * auVar88._8_4_ * 3.0;
      local_1d8._12_4_ = auVar97._12_4_ + fVar120 * auVar88._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar97,auVar97,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_318 = auVar10;
      auVar268 = vsubps_avx(auVar10,auVar97);
      _local_2f8 = auVar11;
      auVar241 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar79._0_4_ = auVar268._0_4_ + auVar241._0_4_;
      auVar79._4_4_ = auVar268._4_4_ + auVar241._4_4_;
      auVar79._8_4_ = auVar268._8_4_ + auVar241._8_4_;
      auVar79._12_4_ = auVar268._12_4_ + auVar241._12_4_;
      auVar268 = vshufps_avx(auVar97,auVar97,0xb1);
      auVar241 = vshufps_avx(local_1d8._0_16_,local_1d8._0_16_,0xb1);
      auVar262._4_4_ = auVar79._0_4_;
      auVar262._0_4_ = auVar79._0_4_;
      auVar262._8_4_ = auVar79._0_4_;
      auVar262._12_4_ = auVar79._0_4_;
      auVar66 = vshufps_avx(auVar79,auVar79,0x55);
      fVar92 = auVar66._0_4_;
      auVar80._0_4_ = fVar92 * auVar268._0_4_;
      fVar93 = auVar66._4_4_;
      auVar80._4_4_ = fVar93 * auVar268._4_4_;
      fVar63 = auVar66._8_4_;
      auVar80._8_4_ = fVar63 * auVar268._8_4_;
      fVar142 = auVar66._12_4_;
      auVar80._12_4_ = fVar142 * auVar268._12_4_;
      auVar149._0_4_ = fVar92 * auVar241._0_4_;
      auVar149._4_4_ = fVar93 * auVar241._4_4_;
      auVar149._8_4_ = fVar63 * auVar241._8_4_;
      auVar149._12_4_ = fVar142 * auVar241._12_4_;
      auVar96 = vfmadd231ps_fma(auVar80,auVar262,auVar97);
      auVar233 = vfmadd231ps_fma(auVar149,auVar262,local_1d8._0_16_);
      auVar241 = vshufps_avx(auVar96,auVar96,0xe8);
      auVar66 = vshufps_avx(auVar233,auVar233,0xe8);
      auVar268 = vcmpps_avx(auVar241,auVar66,1);
      uVar58 = vextractps_avx(auVar268,0);
      auVar121 = auVar233;
      if ((uVar58 & 1) == 0) {
        auVar121 = auVar96;
      }
      auVar123._0_4_ = fVar120 * auVar88._16_4_ * 3.0;
      auVar123._4_4_ = fVar120 * fVar219;
      auVar123._8_4_ = fVar120 * auVar88._24_4_ * 3.0;
      auVar123._12_4_ = fVar120 * auVar119._28_4_;
      local_1f8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
      auVar64 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar180._0_4_ = fVar92 * auVar124._0_4_;
      auVar180._4_4_ = fVar93 * auVar124._4_4_;
      auVar180._8_4_ = fVar63 * auVar124._8_4_;
      auVar180._12_4_ = fVar142 * auVar124._12_4_;
      auVar198._0_4_ = auVar64._0_4_ * fVar92;
      auVar198._4_4_ = auVar64._4_4_ * fVar93;
      auVar198._8_4_ = auVar64._8_4_ * fVar63;
      auVar198._12_4_ = auVar64._12_4_ * fVar142;
      auVar132 = vfmadd231ps_fma(auVar180,auVar262,local_1f8._0_16_);
      auVar143 = vfmadd231ps_fma(auVar198,(undefined1  [16])0x0,auVar262);
      auVar64 = vshufps_avx(auVar132,auVar132,0xe8);
      auVar95 = vshufps_avx(auVar143,auVar143,0xe8);
      auVar119 = ZEXT1664(auVar95);
      auVar124 = vcmpps_avx(auVar64,auVar95,1);
      uVar58 = vextractps_avx(auVar124,0);
      auVar144 = auVar143;
      if ((uVar58 & 1) == 0) {
        auVar144 = auVar132;
      }
      auVar121 = vmaxss_avx(auVar144,auVar121);
      auVar241 = vminps_avx(auVar241,auVar66);
      auVar66 = vminps_avx(auVar64,auVar95);
      auVar66 = vminps_avx(auVar241,auVar66);
      auVar268 = vshufps_avx(auVar268,auVar268,0x55);
      auVar268 = vblendps_avx(auVar268,auVar124,2);
      auVar124 = vpslld_avx(auVar268,0x1f);
      auVar268 = vshufpd_avx(auVar233,auVar233,1);
      auVar268 = vinsertps_avx(auVar268,auVar143,0x9c);
      auVar241 = vshufpd_avx(auVar96,auVar96,1);
      auVar241 = vinsertps_avx(auVar241,auVar132,0x9c);
      auVar268 = vblendvps_avx(auVar241,auVar268,auVar124);
      auVar241 = vmovshdup_avx(auVar268);
      auVar268 = vmaxss_avx(auVar241,auVar268);
      fVar63 = auVar66._0_4_;
      auVar241 = vmovshdup_avx(auVar66);
      fVar93 = auVar268._0_4_;
      fVar120 = auVar241._0_4_;
      fVar92 = auVar121._0_4_;
      if (((0.0001 <= fVar63) || (fVar93 <= -0.0001)) && (0.0001 <= fVar120 || fVar93 <= -0.0001))
      goto code_r0x015f95c0;
      goto LAB_015f95e6;
    }
    auVar12 = vinsertps_avx(auVar12,auVar9,0x10);
    auVar259 = ZEXT1664(auVar12);
    auVar157 = ZEXT1664(CONCAT88(uStack_470,local_478));
    auVar189 = ZEXT1664(local_388);
    auVar203 = ZEXT1664(local_398);
    auVar218 = ZEXT1664(local_3a8);
    auVar119 = ZEXT1664(_local_3b8);
    auVar174 = ZEXT1664(_local_3c8);
    goto LAB_015f8d37;
  }
  if (bVar51) {
    return bVar51;
  }
  fVar61 = ray->tfar;
  auVar87._4_4_ = fVar61;
  auVar87._0_4_ = fVar61;
  auVar87._8_4_ = fVar61;
  auVar87._12_4_ = fVar61;
  auVar12 = vcmpps_avx(local_258,auVar87,2);
  uVar52 = vmovmskps_avx(auVar12);
  uVar52 = SUB84(auVar59,0) & (uint)local_498 & uVar52;
  prim = local_490;
  if (uVar52 == 0) {
    return bVar51;
  }
  goto LAB_015f861c;
code_r0x015f95c0:
  auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar96 = vcmpps_avx(auVar66,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar241 = vandps_avx(auVar96,auVar241);
  if (fVar92 <= -0.0001 || (auVar241 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015f92b2;
LAB_015f95e6:
  auVar96 = vcmpps_avx(auVar66,_DAT_01f7aa10,1);
  auVar233 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar241 = vcmpss_avx(auVar121,ZEXT816(0) << 0x20,1);
  auVar111._8_4_ = 0xbf800000;
  auVar111._0_8_ = 0xbf800000bf800000;
  auVar111._12_4_ = 0xbf800000;
  auVar241 = vblendvps_avx(auVar99,auVar111,auVar241);
  auVar96 = vblendvps_avx(auVar99,auVar111,auVar96);
  fVar219 = auVar96._0_4_;
  fVar142 = auVar241._0_4_;
  auVar241 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar219 == fVar142) && (!NAN(fVar219) && !NAN(fVar142))) {
    auVar241 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar219 == fVar142) && (!NAN(fVar219) && !NAN(fVar142))) {
    auVar233 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar96 = vmovshdup_avx(auVar96);
  fVar175 = auVar96._0_4_;
  if ((fVar219 != fVar175) || (NAN(fVar219) || NAN(fVar175))) {
    auVar181._12_4_ = 0;
    auVar181._0_12_ = ZEXT812(0);
    auVar181 = auVar181 << 0x20;
    if ((fVar120 != fVar63) || (NAN(fVar120) || NAN(fVar63))) {
      auVar125._0_4_ = (float)((uint)fVar63 ^ local_3e8);
      auVar125._4_4_ = auVar66._4_4_ ^ uStack_3e4;
      auVar125._8_4_ = auVar66._8_4_ ^ uStack_3e0;
      auVar125._12_4_ = auVar66._12_4_ ^ uStack_3dc;
      auVar126._0_4_ = auVar125._0_4_ / (fVar120 - fVar63);
      auVar126._4_12_ = auVar125._4_12_;
      auVar66 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar181,auVar126);
      auVar96 = auVar66;
    }
    else {
      auVar66 = ZEXT816(0) << 0x20;
      if ((fVar63 != 0.0) || (auVar96 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar63))) {
        auVar66 = SUB6416(ZEXT464(0x7f800000),0);
        auVar96 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar66);
    auVar233 = vmaxss_avx(auVar96,auVar233);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar181 = auVar42 << 0x20;
  }
  auVar268 = vcmpss_avx(auVar268,auVar181,1);
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar268 = vblendvps_avx(auVar99,auVar112,auVar268);
  fVar120 = auVar268._0_4_;
  auVar268 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar142 != fVar120) || (NAN(fVar142) || NAN(fVar120))) {
    if ((fVar93 != fVar92) || (NAN(fVar93) || NAN(fVar92))) {
      auVar81._0_4_ = (float)((uint)fVar92 ^ local_3e8);
      auVar81._4_4_ = auVar121._4_4_ ^ uStack_3e4;
      auVar81._8_4_ = auVar121._8_4_ ^ uStack_3e0;
      auVar81._12_4_ = auVar121._12_4_ ^ uStack_3dc;
      auVar127._0_4_ = auVar81._0_4_ / (fVar93 - fVar92);
      auVar127._4_12_ = auVar81._4_12_;
      auVar66 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar181,auVar127);
      auVar96 = auVar66;
    }
    else {
      auVar66 = ZEXT816(0) << 0x20;
      if ((fVar92 != 0.0) || (auVar96 = auVar268, NAN(fVar92))) {
        auVar66 = SUB6416(ZEXT464(0x7f800000),0);
        auVar96 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar66);
    auVar233 = vmaxss_avx(auVar96,auVar233);
  }
  if ((fVar175 != fVar120) || (NAN(fVar175) || NAN(fVar120))) {
    auVar241 = vminss_avx(auVar241,auVar268);
    auVar233 = vmaxss_avx(auVar268,auVar233);
  }
  auVar241 = vmaxss_avx(auVar181,auVar241);
  auVar66 = vminss_avx(auVar233,auVar268);
  if (auVar66._0_4_ < auVar241._0_4_) goto LAB_015f92b2;
  auVar241 = vmaxss_avx(auVar181,ZEXT416((uint)(auVar241._0_4_ + -0.1)));
  auVar268 = vminss_avx(ZEXT416((uint)(auVar66._0_4_ + 0.1)),auVar268);
  auVar136._0_8_ = auVar97._0_8_;
  auVar136._8_8_ = auVar136._0_8_;
  auVar210._8_8_ = local_1d8._0_8_;
  auVar210._0_8_ = local_1d8._0_8_;
  auVar222._8_8_ = local_1f8._0_8_;
  auVar222._0_8_ = local_1f8._0_8_;
  auVar66 = vshufpd_avx(local_1d8._0_16_,local_1d8._0_16_,3);
  auVar96 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
  auVar233 = vshufps_avx(auVar241,auVar268,0);
  auVar97 = vsubps_avx(auVar99,auVar233);
  local_318._0_4_ = auVar10._0_4_;
  local_318._4_4_ = auVar10._4_4_;
  fStack_310 = auVar10._8_4_;
  fStack_30c = auVar10._12_4_;
  fVar120 = auVar233._0_4_;
  auVar82._0_4_ = fVar120 * (float)local_318._0_4_;
  fVar92 = auVar233._4_4_;
  auVar82._4_4_ = fVar92 * (float)local_318._4_4_;
  fVar93 = auVar233._8_4_;
  auVar82._8_4_ = fVar93 * fStack_310;
  fVar63 = auVar233._12_4_;
  auVar82._12_4_ = fVar63 * fStack_30c;
  auVar171._0_4_ = fVar120 * auVar66._0_4_;
  auVar171._4_4_ = fVar92 * auVar66._4_4_;
  auVar171._8_4_ = fVar93 * auVar66._8_4_;
  auVar171._12_4_ = fVar63 * auVar66._12_4_;
  auVar182._0_4_ = fVar120 * auVar96._0_4_;
  auVar182._4_4_ = fVar92 * auVar96._4_4_;
  auVar182._8_4_ = fVar93 * auVar96._8_4_;
  auVar182._12_4_ = fVar63 * auVar96._12_4_;
  local_2f8._0_4_ = auVar11._0_4_;
  local_2f8._4_4_ = auVar11._4_4_;
  fStack_2f0 = auVar11._8_4_;
  fStack_2ec = auVar11._12_4_;
  auVar199._0_4_ = fVar120 * (float)local_2f8._0_4_;
  auVar199._4_4_ = fVar92 * (float)local_2f8._4_4_;
  auVar199._8_4_ = fVar93 * fStack_2f0;
  auVar199._12_4_ = fVar63 * fStack_2ec;
  auVar66 = vfmadd231ps_fma(auVar82,auVar97,auVar136);
  auVar96 = vfmadd231ps_fma(auVar171,auVar97,auVar210);
  auVar233 = vfmadd231ps_fma(auVar182,auVar97,auVar222);
  auVar97 = vfmadd231ps_fma(auVar199,auVar97,ZEXT816(0));
  auVar10 = vmovshdup_avx(auVar240);
  auVar132 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar241._0_4_)),auVar240,
                             ZEXT416((uint)(1.0 - auVar241._0_4_)));
  auVar143 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar268._0_4_)),auVar240,
                             ZEXT416((uint)(1.0 - auVar268._0_4_)));
  fVar120 = 1.0 / fVar61;
  auVar268 = vsubps_avx(auVar96,auVar66);
  auVar211._0_4_ = auVar268._0_4_ * 3.0;
  auVar211._4_4_ = auVar268._4_4_ * 3.0;
  auVar211._8_4_ = auVar268._8_4_ * 3.0;
  auVar211._12_4_ = auVar268._12_4_ * 3.0;
  auVar268 = vsubps_avx(auVar233,auVar96);
  auVar223._0_4_ = auVar268._0_4_ * 3.0;
  auVar223._4_4_ = auVar268._4_4_ * 3.0;
  auVar223._8_4_ = auVar268._8_4_ * 3.0;
  auVar223._12_4_ = auVar268._12_4_ * 3.0;
  auVar268 = vsubps_avx(auVar97,auVar233);
  auVar234._0_4_ = auVar268._0_4_ * 3.0;
  auVar234._4_4_ = auVar268._4_4_ * 3.0;
  auVar234._8_4_ = auVar268._8_4_ * 3.0;
  auVar234._12_4_ = auVar268._12_4_ * 3.0;
  auVar10 = vminps_avx(auVar223,auVar234);
  auVar268 = vmaxps_avx(auVar223,auVar234);
  auVar10 = vminps_avx(auVar211,auVar10);
  auVar268 = vmaxps_avx(auVar211,auVar268);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar241 = vshufpd_avx(auVar268,auVar268,3);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar268 = vmaxps_avx(auVar268,auVar241);
  auVar224._0_4_ = auVar10._0_4_ * fVar120;
  auVar224._4_4_ = auVar10._4_4_ * fVar120;
  auVar224._8_4_ = auVar10._8_4_ * fVar120;
  auVar224._12_4_ = auVar10._12_4_ * fVar120;
  auVar212._0_4_ = auVar268._0_4_ * fVar120;
  auVar212._4_4_ = auVar268._4_4_ * fVar120;
  auVar212._8_4_ = auVar268._8_4_ * fVar120;
  auVar212._12_4_ = auVar268._12_4_ * fVar120;
  fVar120 = 1.0 / (auVar143._0_4_ - auVar132._0_4_);
  auVar268 = vshufpd_avx(auVar66,auVar66,3);
  auVar10 = vshufpd_avx(auVar96,auVar96,3);
  auVar11 = vshufpd_avx(auVar233,auVar233,3);
  auVar241 = vshufpd_avx(auVar97,auVar97,3);
  auVar268 = vsubps_avx(auVar268,auVar66);
  auVar66 = vsubps_avx(auVar10,auVar96);
  auVar96 = vsubps_avx(auVar11,auVar233);
  auVar241 = vsubps_avx(auVar241,auVar97);
  auVar10 = vminps_avx(auVar268,auVar66);
  auVar268 = vmaxps_avx(auVar268,auVar66);
  auVar11 = vminps_avx(auVar96,auVar241);
  auVar11 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar96,auVar241);
  auVar268 = vmaxps_avx(auVar268,auVar10);
  auVar253._0_4_ = fVar120 * auVar11._0_4_;
  auVar253._4_4_ = fVar120 * auVar11._4_4_;
  auVar253._8_4_ = fVar120 * auVar11._8_4_;
  auVar253._12_4_ = fVar120 * auVar11._12_4_;
  auVar242._0_4_ = fVar120 * auVar268._0_4_;
  auVar242._4_4_ = fVar120 * auVar268._4_4_;
  auVar242._8_4_ = fVar120 * auVar268._8_4_;
  auVar242._12_4_ = fVar120 * auVar268._12_4_;
  auVar241 = vinsertps_avx(auVar12,auVar132,0x10);
  auVar66 = vinsertps_avx(auVar9,auVar143,0x10);
  auVar235._0_4_ = (auVar241._0_4_ + auVar66._0_4_) * 0.5;
  auVar235._4_4_ = (auVar241._4_4_ + auVar66._4_4_) * 0.5;
  auVar235._8_4_ = (auVar241._8_4_ + auVar66._8_4_) * 0.5;
  auVar235._12_4_ = (auVar241._12_4_ + auVar66._12_4_) * 0.5;
  auVar83._4_4_ = auVar235._0_4_;
  auVar83._0_4_ = auVar235._0_4_;
  auVar83._8_4_ = auVar235._0_4_;
  auVar83._12_4_ = auVar235._0_4_;
  auVar268 = vfmadd213ps_fma(local_208,auVar83,local_468);
  auVar10 = vfmadd213ps_fma(local_218,auVar83,local_4b8);
  auVar11 = vfmadd213ps_fma(local_228,auVar83,local_4c8);
  auVar9 = vsubps_avx(auVar10,auVar268);
  auVar268 = vfmadd213ps_fma(auVar9,auVar83,auVar268);
  auVar9 = vsubps_avx(auVar11,auVar10);
  auVar9 = vfmadd213ps_fma(auVar9,auVar83,auVar10);
  auVar9 = vsubps_avx(auVar9,auVar268);
  auVar268 = vfmadd231ps_fma(auVar268,auVar9,auVar83);
  auVar84._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar84._8_4_ = auVar9._8_4_ * 3.0;
  auVar84._12_4_ = auVar9._12_4_ * 3.0;
  auVar263._8_8_ = auVar268._0_8_;
  auVar263._0_8_ = auVar268._0_8_;
  auVar9 = vshufpd_avx(auVar268,auVar268,3);
  auVar268 = vshufps_avx(auVar235,auVar235,0x55);
  auVar233 = vsubps_avx(auVar9,auVar263);
  auVar121 = vfmadd231ps_fma(auVar263,auVar268,auVar233);
  auVar269._8_8_ = auVar84._0_8_;
  auVar269._0_8_ = auVar84._0_8_;
  auVar9 = vshufpd_avx(auVar84,auVar84,3);
  auVar9 = vsubps_avx(auVar9,auVar269);
  auVar97 = vfmadd213ps_fma(auVar9,auVar268,auVar269);
  auVar268 = vmovshdup_avx(auVar97);
  auVar270._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
  auVar270._8_4_ = auVar268._8_4_ ^ 0x80000000;
  auVar270._12_4_ = auVar268._12_4_ ^ 0x80000000;
  auVar10 = vmovshdup_avx(auVar233);
  auVar9 = vunpcklps_avx(auVar10,auVar270);
  auVar11 = vshufps_avx(auVar9,auVar270,4);
  auVar96 = vshufps_avx(auVar235,auVar235,0x54);
  auVar128._0_8_ = auVar233._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar233._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar233._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar128,auVar97);
  auVar9 = vshufps_avx(auVar9,auVar97,8);
  auVar268 = vfmsub231ss_fma(ZEXT416((uint)(auVar233._0_4_ * auVar268._0_4_)),auVar10,auVar97);
  uVar62 = auVar268._0_4_;
  auVar85._4_4_ = uVar62;
  auVar85._0_4_ = uVar62;
  auVar85._8_4_ = uVar62;
  auVar85._12_4_ = uVar62;
  auVar268 = vdivps_avx(auVar11,auVar85);
  auVar10 = vdivps_avx(auVar9,auVar85);
  fVar93 = auVar121._0_4_;
  fVar120 = auVar268._0_4_;
  auVar9 = vshufps_avx(auVar121,auVar121,0x55);
  fVar92 = auVar10._0_4_;
  auVar86._0_4_ = fVar93 * fVar120 + auVar9._0_4_ * fVar92;
  auVar86._4_4_ = fVar93 * auVar268._4_4_ + auVar9._4_4_ * auVar10._4_4_;
  auVar86._8_4_ = fVar93 * auVar268._8_4_ + auVar9._8_4_ * auVar10._8_4_;
  auVar86._12_4_ = fVar93 * auVar268._12_4_ + auVar9._12_4_ * auVar10._12_4_;
  auVar95 = vsubps_avx(auVar96,auVar86);
  auVar96 = vmovshdup_avx(auVar268);
  auVar9 = vinsertps_avx(auVar224,auVar253,0x1c);
  auVar150._0_4_ = auVar96._0_4_ * auVar9._0_4_;
  auVar150._4_4_ = auVar96._4_4_ * auVar9._4_4_;
  auVar150._8_4_ = auVar96._8_4_ * auVar9._8_4_;
  auVar150._12_4_ = auVar96._12_4_ * auVar9._12_4_;
  auVar11 = vinsertps_avx(auVar212,auVar242,0x1c);
  auVar100._0_4_ = auVar11._0_4_ * auVar96._0_4_;
  auVar100._4_4_ = auVar11._4_4_ * auVar96._4_4_;
  auVar100._8_4_ = auVar11._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar11._12_4_ * auVar96._12_4_;
  auVar121 = vminps_avx(auVar150,auVar100);
  auVar97 = vmaxps_avx(auVar100,auVar150);
  auVar96 = vinsertps_avx(auVar253,auVar224,0x4c);
  auVar124 = vmovshdup_avx(auVar10);
  auVar233 = vinsertps_avx(auVar242,auVar212,0x4c);
  auVar243._0_4_ = auVar124._0_4_ * auVar96._0_4_;
  auVar243._4_4_ = auVar124._4_4_ * auVar96._4_4_;
  auVar243._8_4_ = auVar124._8_4_ * auVar96._8_4_;
  auVar243._12_4_ = auVar124._12_4_ * auVar96._12_4_;
  auVar225._0_4_ = auVar124._0_4_ * auVar233._0_4_;
  auVar225._4_4_ = auVar124._4_4_ * auVar233._4_4_;
  auVar225._8_4_ = auVar124._8_4_ * auVar233._8_4_;
  auVar225._12_4_ = auVar124._12_4_ * auVar233._12_4_;
  auVar124 = vminps_avx(auVar243,auVar225);
  auVar254._0_4_ = auVar121._0_4_ + auVar124._0_4_;
  auVar254._4_4_ = auVar121._4_4_ + auVar124._4_4_;
  auVar254._8_4_ = auVar121._8_4_ + auVar124._8_4_;
  auVar254._12_4_ = auVar121._12_4_ + auVar124._12_4_;
  auVar121 = vmaxps_avx(auVar225,auVar243);
  auVar101._0_4_ = auVar121._0_4_ + auVar97._0_4_;
  auVar101._4_4_ = auVar121._4_4_ + auVar97._4_4_;
  auVar101._8_4_ = auVar121._8_4_ + auVar97._8_4_;
  auVar101._12_4_ = auVar121._12_4_ + auVar97._12_4_;
  auVar226._8_8_ = 0x3f80000000000000;
  auVar226._0_8_ = 0x3f80000000000000;
  auVar97 = vsubps_avx(auVar226,auVar101);
  auVar121 = vsubps_avx(auVar226,auVar254);
  auVar124 = vsubps_avx(auVar241,auVar235);
  auVar64 = vsubps_avx(auVar66,auVar235);
  auVar113._0_4_ = fVar120 * auVar9._0_4_;
  auVar113._4_4_ = fVar120 * auVar9._4_4_;
  auVar113._8_4_ = fVar120 * auVar9._8_4_;
  auVar113._12_4_ = fVar120 * auVar9._12_4_;
  auVar255._0_4_ = fVar120 * auVar11._0_4_;
  auVar255._4_4_ = fVar120 * auVar11._4_4_;
  auVar255._8_4_ = fVar120 * auVar11._8_4_;
  auVar255._12_4_ = fVar120 * auVar11._12_4_;
  auVar11 = vminps_avx(auVar113,auVar255);
  auVar9 = vmaxps_avx(auVar255,auVar113);
  auVar151._0_4_ = fVar92 * auVar96._0_4_;
  auVar151._4_4_ = fVar92 * auVar96._4_4_;
  auVar151._8_4_ = fVar92 * auVar96._8_4_;
  auVar151._12_4_ = fVar92 * auVar96._12_4_;
  auVar213._0_4_ = fVar92 * auVar233._0_4_;
  auVar213._4_4_ = fVar92 * auVar233._4_4_;
  auVar213._8_4_ = fVar92 * auVar233._8_4_;
  auVar213._12_4_ = fVar92 * auVar233._12_4_;
  auVar96 = vminps_avx(auVar151,auVar213);
  auVar256._0_4_ = auVar11._0_4_ + auVar96._0_4_;
  auVar256._4_4_ = auVar11._4_4_ + auVar96._4_4_;
  auVar256._8_4_ = auVar11._8_4_ + auVar96._8_4_;
  auVar256._12_4_ = auVar11._12_4_ + auVar96._12_4_;
  fVar175 = auVar124._0_4_;
  auVar264._0_4_ = fVar175 * auVar97._0_4_;
  fVar190 = auVar124._4_4_;
  auVar264._4_4_ = fVar190 * auVar97._4_4_;
  fVar191 = auVar124._8_4_;
  auVar264._8_4_ = fVar191 * auVar97._8_4_;
  fVar192 = auVar124._12_4_;
  auVar264._12_4_ = fVar192 * auVar97._12_4_;
  auVar11 = vmaxps_avx(auVar213,auVar151);
  auVar214._0_4_ = fVar175 * auVar121._0_4_;
  auVar214._4_4_ = fVar190 * auVar121._4_4_;
  auVar214._8_4_ = fVar191 * auVar121._8_4_;
  auVar214._12_4_ = fVar192 * auVar121._12_4_;
  fVar93 = auVar64._0_4_;
  auVar102._0_4_ = fVar93 * auVar97._0_4_;
  fVar63 = auVar64._4_4_;
  auVar102._4_4_ = fVar63 * auVar97._4_4_;
  fVar142 = auVar64._8_4_;
  auVar102._8_4_ = fVar142 * auVar97._8_4_;
  fVar219 = auVar64._12_4_;
  auVar102._12_4_ = fVar219 * auVar97._12_4_;
  auVar227._0_4_ = fVar93 * auVar121._0_4_;
  auVar227._4_4_ = fVar63 * auVar121._4_4_;
  auVar227._8_4_ = fVar142 * auVar121._8_4_;
  auVar227._12_4_ = fVar219 * auVar121._12_4_;
  auVar114._0_4_ = auVar9._0_4_ + auVar11._0_4_;
  auVar114._4_4_ = auVar9._4_4_ + auVar11._4_4_;
  auVar114._8_4_ = auVar9._8_4_ + auVar11._8_4_;
  auVar114._12_4_ = auVar9._12_4_ + auVar11._12_4_;
  auVar152._8_8_ = 0x3f800000;
  auVar152._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar152,auVar114);
  auVar11 = vsubps_avx(auVar152,auVar256);
  auVar257._0_4_ = fVar175 * auVar9._0_4_;
  auVar257._4_4_ = fVar190 * auVar9._4_4_;
  auVar257._8_4_ = fVar191 * auVar9._8_4_;
  auVar257._12_4_ = fVar192 * auVar9._12_4_;
  auVar244._0_4_ = fVar175 * auVar11._0_4_;
  auVar244._4_4_ = fVar190 * auVar11._4_4_;
  auVar244._8_4_ = fVar191 * auVar11._8_4_;
  auVar244._12_4_ = fVar192 * auVar11._12_4_;
  auVar115._0_4_ = fVar93 * auVar9._0_4_;
  auVar115._4_4_ = fVar63 * auVar9._4_4_;
  auVar115._8_4_ = fVar142 * auVar9._8_4_;
  auVar115._12_4_ = fVar219 * auVar9._12_4_;
  auVar153._0_4_ = fVar93 * auVar11._0_4_;
  auVar153._4_4_ = fVar63 * auVar11._4_4_;
  auVar153._8_4_ = fVar142 * auVar11._8_4_;
  auVar153._12_4_ = fVar219 * auVar11._12_4_;
  auVar9 = vminps_avx(auVar257,auVar244);
  auVar11 = vminps_avx(auVar115,auVar153);
  auVar9 = vminps_avx(auVar9,auVar11);
  auVar11 = vmaxps_avx(auVar244,auVar257);
  auVar96 = vmaxps_avx(auVar153,auVar115);
  auVar233 = vminps_avx(auVar264,auVar214);
  auVar97 = vminps_avx(auVar102,auVar227);
  auVar233 = vminps_avx(auVar233,auVar97);
  auVar9 = vhaddps_avx(auVar9,auVar233);
  auVar11 = vmaxps_avx(auVar96,auVar11);
  auVar96 = vmaxps_avx(auVar214,auVar264);
  auVar233 = vmaxps_avx(auVar227,auVar102);
  auVar96 = vmaxps_avx(auVar233,auVar96);
  auVar11 = vhaddps_avx(auVar11,auVar96);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar11 = vshufps_avx(auVar11,auVar11,0xe8);
  auVar228._0_4_ = auVar95._0_4_ + auVar9._0_4_;
  auVar228._4_4_ = auVar95._4_4_ + auVar9._4_4_;
  auVar228._8_4_ = auVar95._8_4_ + auVar9._8_4_;
  auVar228._12_4_ = auVar95._12_4_ + auVar9._12_4_;
  auVar215._0_4_ = auVar95._0_4_ + auVar11._0_4_;
  auVar215._4_4_ = auVar95._4_4_ + auVar11._4_4_;
  auVar215._8_4_ = auVar95._8_4_ + auVar11._8_4_;
  auVar215._12_4_ = auVar95._12_4_ + auVar11._12_4_;
  auVar119 = ZEXT1664(auVar215);
  auVar9 = vmaxps_avx(auVar241,auVar228);
  auVar11 = vminps_avx(auVar215,auVar66);
  auVar9 = vcmpps_avx(auVar11,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_015f92b2;
  bVar54 = 0;
  if ((auVar188._0_4_ < auVar228._0_4_) && (bVar54 = 0, auVar215._0_4_ < auVar66._0_4_)) {
    auVar11 = vmovshdup_avx(auVar228);
    auVar9 = vcmpps_avx(auVar215,auVar66,1);
    bVar54 = auVar9[4] & auVar132._0_4_ < auVar11._0_4_;
  }
  if (((3 < uVar60 || fVar61 < 0.001) | bVar54) == 1) {
    lVar56 = 200;
    auVar119 = ZEXT1664(local_468);
    do {
      fVar63 = auVar95._0_4_;
      fVar93 = 1.0 - fVar63;
      fVar61 = fVar93 * fVar93 * fVar93;
      fVar91 = fVar63 * 3.0 * fVar93 * fVar93;
      fVar93 = fVar93 * fVar63 * fVar63 * 3.0;
      auVar137._4_4_ = fVar61;
      auVar137._0_4_ = fVar61;
      auVar137._8_4_ = fVar61;
      auVar137._12_4_ = fVar61;
      auVar116._4_4_ = fVar91;
      auVar116._0_4_ = fVar91;
      auVar116._8_4_ = fVar91;
      auVar116._12_4_ = fVar91;
      auVar103._4_4_ = fVar93;
      auVar103._0_4_ = fVar93;
      auVar103._8_4_ = fVar93;
      auVar103._12_4_ = fVar93;
      fVar63 = fVar63 * fVar63 * fVar63;
      auVar154._0_4_ = (float)local_238._0_4_ * fVar63;
      auVar154._4_4_ = (float)local_238._4_4_ * fVar63;
      auVar154._8_4_ = fStack_230 * fVar63;
      auVar154._12_4_ = fStack_22c * fVar63;
      auVar12 = vfmadd231ps_fma(auVar154,local_4c8,auVar103);
      auVar12 = vfmadd231ps_fma(auVar12,local_4b8,auVar116);
      auVar12 = vfmadd231ps_fma(auVar12,local_468,auVar137);
      auVar104._8_8_ = auVar12._0_8_;
      auVar104._0_8_ = auVar12._0_8_;
      auVar12 = vshufpd_avx(auVar12,auVar12,3);
      auVar9 = vshufps_avx(auVar95,auVar95,0x55);
      auVar12 = vsubps_avx(auVar12,auVar104);
      auVar9 = vfmadd213ps_fma(auVar12,auVar9,auVar104);
      fVar61 = auVar9._0_4_;
      auVar12 = vshufps_avx(auVar9,auVar9,0x55);
      auVar105._0_4_ = fVar120 * fVar61 + fVar92 * auVar12._0_4_;
      auVar105._4_4_ = auVar268._4_4_ * fVar61 + auVar10._4_4_ * auVar12._4_4_;
      auVar105._8_4_ = auVar268._8_4_ * fVar61 + auVar10._8_4_ * auVar12._8_4_;
      auVar105._12_4_ = auVar268._12_4_ * fVar61 + auVar10._12_4_ * auVar12._12_4_;
      auVar95 = vsubps_avx(auVar95,auVar105);
      auVar12 = vandps_avx(local_3d8,auVar9);
      auVar9 = vshufps_avx(auVar12,auVar12,0xf5);
      auVar12 = vmaxss_avx(auVar9,auVar12);
      if (auVar12._0_4_ < (float)local_4a8._0_4_) {
        fVar61 = auVar95._0_4_;
        if ((0.0 <= fVar61) && (fVar61 <= 1.0)) {
          auVar12 = vmovshdup_avx(auVar95);
          fVar91 = auVar12._0_4_;
          if ((0.0 <= fVar91) && (fVar91 <= 1.0)) {
            auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
            auVar96 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28)
            ;
            aVar1 = (ray->org).field_0;
            auVar12 = vsubps_avx(local_3f8,(undefined1  [16])aVar1);
            auVar12 = vdpps_avx(auVar12,auVar96,0x7f);
            auVar9 = vsubps_avx(local_428,(undefined1  [16])aVar1);
            auVar9 = vdpps_avx(auVar9,auVar96,0x7f);
            auVar268 = vsubps_avx(local_438,(undefined1  [16])aVar1);
            auVar268 = vdpps_avx(auVar268,auVar96,0x7f);
            auVar10 = vsubps_avx(local_418,(undefined1  [16])aVar1);
            auVar10 = vdpps_avx(auVar10,auVar96,0x7f);
            auVar11 = vsubps_avx(_local_408,(undefined1  [16])aVar1);
            auVar11 = vdpps_avx(auVar11,auVar96,0x7f);
            auVar241 = vsubps_avx(_local_448,(undefined1  [16])aVar1);
            auVar241 = vdpps_avx(auVar241,auVar96,0x7f);
            auVar66 = vsubps_avx(_local_458,(undefined1  [16])aVar1);
            auVar66 = vdpps_avx(auVar66,auVar96,0x7f);
            auVar45._4_4_ = fStack_484;
            auVar45._0_4_ = local_488;
            auVar45._8_4_ = fStack_480;
            auVar45._12_4_ = fStack_47c;
            auVar233 = vsubps_avx(auVar45,(undefined1  [16])aVar1);
            auVar96 = vdpps_avx(auVar233,auVar96,0x7f);
            fVar120 = 1.0 - fVar91;
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar91)),ZEXT416((uint)fVar120)
                                      ,auVar12);
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar241._0_4_ * fVar91)),ZEXT416((uint)fVar120)
                                     ,auVar9);
            auVar268 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar91)),
                                       ZEXT416((uint)fVar120),auVar268);
            auVar119 = ZEXT1664(auVar268);
            auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar91 * auVar96._0_4_)),ZEXT416((uint)fVar120)
                                      ,auVar10);
            fVar93 = 1.0 - fVar61;
            fVar91 = fVar93 * fVar61 * fVar61 * 3.0;
            fVar142 = fVar61 * fVar61 * fVar61;
            auVar268 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar142)),
                                       ZEXT416((uint)fVar91),auVar268);
            fVar120 = fVar61 * 3.0 * fVar93 * fVar93;
            auVar9 = vfmadd231ss_fma(auVar268,ZEXT416((uint)fVar120),auVar9);
            fVar92 = fVar93 * fVar93 * fVar93;
            auVar12 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar92),auVar12);
            fVar63 = auVar12._0_4_;
            if (((ray->org).field_0.m128[3] <= fVar63) && (fVar63 <= ray->tfar)) {
              local_508 = auVar59;
              pGVar4 = (context->scene->geometries).items[uVar52].ptr;
              if ((pGVar4->mask & ray->mask) == 0) {
                bVar54 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar54 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auStack_514 = auVar143._4_12_;
                local_518 = ray->tfar;
                auVar12 = vshufps_avx(auVar95,auVar95,0x55);
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar9 = vsubps_avx(auVar200,auVar12);
                fVar219 = auVar12._0_4_;
                auVar216._0_4_ = fVar219 * (float)local_408._0_4_;
                fVar175 = auVar12._4_4_;
                auVar216._4_4_ = fVar175 * (float)local_408._4_4_;
                fVar190 = auVar12._8_4_;
                auVar216._8_4_ = fVar190 * fStack_400;
                fVar191 = auVar12._12_4_;
                auVar216._12_4_ = fVar191 * fStack_3fc;
                auVar229._0_4_ = fVar219 * (float)local_448._0_4_;
                auVar229._4_4_ = fVar175 * (float)local_448._4_4_;
                auVar229._8_4_ = fVar190 * fStack_440;
                auVar229._12_4_ = fVar191 * fStack_43c;
                auVar236._0_4_ = fVar219 * (float)local_458._0_4_;
                auVar236._4_4_ = fVar175 * (float)local_458._4_4_;
                auVar236._8_4_ = fVar190 * fStack_450;
                auVar236._12_4_ = fVar191 * fStack_44c;
                auVar183._0_4_ = fVar219 * local_488;
                auVar183._4_4_ = fVar175 * fStack_484;
                auVar183._8_4_ = fVar190 * fStack_480;
                auVar183._12_4_ = fVar191 * fStack_47c;
                auVar12 = vfmadd231ps_fma(auVar216,auVar9,local_3f8);
                auVar268 = vfmadd231ps_fma(auVar229,auVar9,local_428);
                auVar10 = vfmadd231ps_fma(auVar236,auVar9,local_438);
                auVar11 = vfmadd231ps_fma(auVar183,auVar9,local_418);
                auVar12 = vsubps_avx(auVar268,auVar12);
                auVar9 = vsubps_avx(auVar10,auVar268);
                auVar119 = ZEXT1664(auVar9);
                auVar268 = vsubps_avx(auVar11,auVar10);
                auVar237._0_4_ = fVar61 * auVar9._0_4_;
                auVar237._4_4_ = fVar61 * auVar9._4_4_;
                auVar237._8_4_ = fVar61 * auVar9._8_4_;
                auVar237._12_4_ = fVar61 * auVar9._12_4_;
                auVar172._4_4_ = fVar93;
                auVar172._0_4_ = fVar93;
                auVar172._8_4_ = fVar93;
                auVar172._12_4_ = fVar93;
                auVar12 = vfmadd231ps_fma(auVar237,auVar172,auVar12);
                auVar184._0_4_ = fVar61 * auVar268._0_4_;
                auVar184._4_4_ = fVar61 * auVar268._4_4_;
                auVar184._8_4_ = fVar61 * auVar268._8_4_;
                auVar184._12_4_ = fVar61 * auVar268._12_4_;
                auVar268 = vfmadd231ps_fma(auVar184,auVar172,auVar9);
                auVar185._0_4_ = fVar61 * auVar268._0_4_;
                auVar185._4_4_ = fVar61 * auVar268._4_4_;
                auVar185._8_4_ = fVar61 * auVar268._8_4_;
                auVar185._12_4_ = fVar61 * auVar268._12_4_;
                auVar268 = vfmadd231ps_fma(auVar185,auVar172,auVar12);
                auVar155._0_4_ = fVar142 * (float)local_298._0_4_;
                auVar155._4_4_ = fVar142 * (float)local_298._4_4_;
                auVar155._8_4_ = fVar142 * fStack_290;
                auVar155._12_4_ = fVar142 * fStack_28c;
                auVar117._4_4_ = fVar91;
                auVar117._0_4_ = fVar91;
                auVar117._8_4_ = fVar91;
                auVar117._12_4_ = fVar91;
                auVar12 = vfmadd132ps_fma(auVar117,auVar155,local_288);
                auVar138._4_4_ = fVar120;
                auVar138._0_4_ = fVar120;
                auVar138._8_4_ = fVar120;
                auVar138._12_4_ = fVar120;
                auVar12 = vfmadd132ps_fma(auVar138,auVar12,local_278);
                auVar118._0_4_ = auVar268._0_4_ * 3.0;
                auVar118._4_4_ = auVar268._4_4_ * 3.0;
                auVar118._8_4_ = auVar268._8_4_ * 3.0;
                auVar118._12_4_ = auVar268._12_4_ * 3.0;
                auVar129._4_4_ = fVar92;
                auVar129._0_4_ = fVar92;
                auVar129._8_4_ = fVar92;
                auVar129._12_4_ = fVar92;
                auVar268 = vfmadd132ps_fma(auVar129,auVar12,local_268);
                auVar12 = vshufps_avx(auVar118,auVar118,0xc9);
                auVar139._0_4_ = auVar268._0_4_ * auVar12._0_4_;
                auVar139._4_4_ = auVar268._4_4_ * auVar12._4_4_;
                auVar139._8_4_ = auVar268._8_4_ * auVar12._8_4_;
                auVar139._12_4_ = auVar268._12_4_ * auVar12._12_4_;
                auVar12 = vshufps_avx(auVar268,auVar268,0xc9);
                auVar268 = vfmsub231ps_fma(auVar139,auVar118,auVar12);
                auVar12 = vshufps_avx(auVar268,auVar268,0xe9);
                local_2c8 = vmovlps_avx(auVar12);
                local_2c0 = auVar268._0_4_;
                local_2bc = vmovlps_avx(auVar95);
                local_2b4 = (int)local_370;
                local_2b0 = uVar52;
                local_2ac = context->user->instID[0];
                local_2a8 = context->user->instPrimID[0];
                ray->tfar = fVar63;
                local_51c = -1;
                local_348.geometryUserPtr = pGVar4->userPtr;
                local_348.context = context->user;
                local_348.hit = (RTCHitN *)&local_2c8;
                local_348.N = 1;
                local_348.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015f9fec:
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar119 = ZEXT1664(auVar119._0_16_);
                    (*p_Var7)(&local_348);
                    if (*local_348.valid == 0) goto LAB_015fa060;
                  }
                  bVar54 = 1;
                }
                else {
                  local_4e8._0_8_ = context;
                  auVar119 = ZEXT1664(auVar9);
                  (*pGVar4->occlusionFilterN)(&local_348);
                  context = (RayQueryContext *)local_4e8._0_8_;
                  if (*local_348.valid != 0) goto LAB_015f9fec;
LAB_015fa060:
                  ray->tfar = local_518;
                  bVar54 = 0;
                }
              }
              bVar51 = (bool)(bVar51 | bVar54);
              auVar59 = local_508;
            }
          }
        }
        break;
      }
      lVar56 = lVar56 + -1;
    } while (lVar56 != 0);
    goto LAB_015f92b2;
  }
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar91),0x10);
  auVar259 = ZEXT1664(auVar12);
  auVar12 = vinsertps_avx(auVar132,ZEXT416((uint)auVar143._0_4_),0x10);
  auVar248 = ZEXT1664(auVar12);
  auVar157 = ZEXT1664(CONCAT88(uStack_470,local_478));
  auVar189 = ZEXT1664(local_388);
  auVar203 = ZEXT1664(local_398);
  auVar218 = ZEXT1664(local_3a8);
  auVar119 = ZEXT1664(_local_3b8);
  auVar174 = ZEXT1664(_local_3c8);
  goto LAB_015f8d37;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }